

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O2

void Js::AsmJsByteCodeDumper::DumpOp
               (OpCodeAsmJs op,LayoutSize layoutSize,ByteCodeReader *reader,
               FunctionBody *dumpFunction)

{
  code *pcVar1;
  bool bVar2;
  OpLayoutTypeAsmJs OVar3;
  char16 *pcVar4;
  OpLayoutElementSlot_Small *data;
  OpLayoutFloat32x4_3_Small *data_00;
  OpLayoutLong1Reg1_Small *data_01;
  OpLayoutFloat32x4_1Int16x8_1_Small *data_02;
  OpLayoutWasmMemAccess_Small *data_03;
  OpLayoutReg1Int1_Small *data_04;
  OpLayoutLong2_Small *data_05;
  OpLayoutInt32x4_3_Small *data_06;
  OpLayoutFloat32x4_1Float4_Small *data_07;
  OpLayoutInt32x4_2Int1_Small *data_08;
  OpLayoutAsmReg11_Small *data_09;
  OpLayoutInt8x16_3_Small *data_10;
  OpLayoutInt8x16_1Int16_Small *data_11;
  OpLayoutBool32x4_1Uint32x4_2_Small *data_12;
  OpLayoutUint16x8_1Int8_Small *data_13;
  OpLayoutAsmBr *pOVar5;
  OpLayoutUint32x4_1Int16x8_1_Small *data_14;
  OpLayoutUint16x8_2Int1_Small *data_15;
  OpLayoutInt8x16_2Int16_Small *data_16;
  OpLayoutInt16x8_2Int8_Small *data_17;
  OpLayoutUint32x4_1Bool32x4_1Uint32x4_2_Small *data_18;
  OpLayoutInt16x8_1Bool16x8_1Int16x8_2_Small *data_19;
  OpLayoutFloat1Reg1_Small *data_20;
  OpLayoutLong1Int64x2_1Int1_Small *data_21;
  OpLayoutAsmSimdTypedArr_Small *data_22;
  OpLayoutLong1Double1_Small *data_23;
  OpLayoutInt16x8_2Int1_Small *data_24;
  OpLayoutUint16x8_1Int8x16_1_Small *data_25;
  OpLayoutFloat64x2_2Int1Double1_Small *data_26;
  OpLayoutAsmReg3_Small *data_27;
  OpLayoutBool16x8_1Int1_Small *data_28;
  OpLayoutReg1Double1_Small *data_29;
  OpLayoutFloat32x4_1Int8x16_1_Small *data_30;
  OpLayoutAsmTypedArr_Medium *data_31;
  OpLayoutLong1Const1_Small *data_32;
  OpLayoutInt1Float1_Medium *data_33;
  OpLayoutFloat1Double1_Small *data_34;
  OpLayoutInt16x8_3Int8_Small *data_35;
  OpLayoutFloat1Long1_Medium *data_36;
  OpLayoutLong3_Small *data_37;
  OpLayoutUint16x8_1Int16x8_1_Small *data_38;
  OpLayoutLong1Int1_Medium *data_39;
  OpLayoutFloat32x4_1Bool32x4_1Float32x4_2_Medium *data_40;
  OpLayoutInt32x4_4_Small *data_41;
  OpLayoutLong1Const1_Medium *data_42;
  OpLayoutBool16x8_3_Small *data_43;
  OpLayoutFloat32x4_1Uint8x16_1_Small *data_44;
  OpLayoutInt64x2_2_Small *data_45;
  OpLayoutInt32x4_4_Medium *data_46;
  OpLayoutFloat64x2_1Double1_Small *data_47;
  OpLayoutFloat1Const1_Medium *data_48;
  OpLayoutFloat32x4_4_Medium *data_49;
  OpLayoutInt1Long1_Medium *data_50;
  OpLayoutInt32x4_1Uint16x8_1_Small *data_51;
  OpLayoutInt1Bool8x16_1Int1_Small *data_52;
  OpLayoutReg1Long1_Medium *data_53;
  OpLayoutUint32x4_1Uint8x16_1_Small *data_54;
  OpLayoutWasmLoopStart_Medium *pOVar6;
  OpLayoutAsmReg18_Small *data_55;
  OpLayoutBool8x16_1Uint8x16_2_Small *data_56;
  OpLayoutInt32x4_2Int4_Small *data_57;
  OpLayoutInt16x8_1Int1_Small *data_58;
  OpLayoutFloat32x4_2Float1_Small *data_59;
  OpLayoutFloat32x4_1Bool32x4_1Float32x4_2_Small *data_60;
  OpLayoutUint32x4_2Int1_Small *data_61;
  OpLayoutBool16x8_1Uint16x8_2_Small *data_62;
  OpLayoutAsmReg9_Medium *data_63;
  OpLayoutInt1Int8x16_1Int1_Medium *data_64;
  OpLayoutFloat32x4_3_Medium *data_65;
  OpLayoutFloat32x4_3Int4_Small *data_66;
  OpLayoutFloat32x4_1Float1_Medium *data_67;
  OpLayoutFloat64x2_1Double1_Medium *data_68;
  OpLayoutStartCall *data_69;
  OpLayoutDouble1Int1_Medium *data_70;
  OpLayoutInt8x16_1Float32x4_1_Small *data_71;
  OpLayoutInt32x4_1Int8x16_1_Medium *data_72;
  OpLayoutBool8x16_2Int2_Small *data_73;
  OpLayoutBool32x4_1Int32x4_2_Medium *data_74;
  OpLayoutUint32x4_2Int2_Medium *data_75;
  OpLayoutInt3_Medium *data_76;
  OpLayoutAsmReg11_Medium *data_77;
  OpLayoutUint8x16_1Int32x4_1_Medium *data_78;
  OpLayoutDouble3_Small *data_79;
  OpLayoutReg1Float1_Medium *data_80;
  OpLayoutUint8x16_1Int8x16_1_Medium *data_81;
  OpLayoutUint16x8_2Int1_Medium *data_82;
  OpLayoutFloat32x4_1Float4_Medium *data_83;
  OpLayoutFloat1Const1_Small *data_84;
  OpLayoutInt1Reg1_Medium *data_85;
  OpLayoutUint16x8_2Int2_Medium *data_86;
  OpLayoutBool32x4_1Int1_Medium *data_87;
  OpLayoutInt8x16_1Uint16x8_1_Medium *data_88;
  OpLayoutInt8x16_3Int16_Small *data_89;
  OpLayoutFloat32x4_1Uint8x16_1_Medium *data_90;
  OpLayoutUint16x8_1Int16x8_1_Medium *data_91;
  OpLayoutUint32x4_2Int1_Medium *data_92;
  OpLayoutInt32x4_1Int1_Medium *data_93;
  OpLayoutInt1Bool16x8_1_Small *data_94;
  OpLayoutFloat1Float32x4_1Int1_Medium *data_95;
  OpLayoutDouble1Int1_Small *data_96;
  OpLayoutInt1Long1_Small *data_97;
  OpLayoutLong1Float1_Medium *data_98;
  OpLayoutBool16x8_2Int2_Medium *data_99;
  OpLayoutInt32x4_1Int4_Small *data_x00100;
  OpLayoutReg1Uint8x16_1_Medium *data_x00101;
  OpLayoutReg1Uint32x4_1_Small *data_x00102;
  OpLayoutInt32x4_1Uint8x16_1_Medium *data_x00103;
  OpLayoutInt1Bool16x8_1_Medium *data_x00104;
  OpLayoutBool16x8_3_Medium *data_x00105;
  OpLayoutReg1IntConst1_Small *data_x00106;
  OpLayoutAsmReg2_Medium *data_x00107;
  OpLayoutAsmCall_Large *data_x00108;
  OpLayoutInt8x16_1Int1_Medium *data_x00109;
  OpLayoutInt64x2_2_Int1_Long1_Medium *data_x00110;
  OpLayoutUint8x16_1Uint32x4_1_Small *data_x00111;
  OpLayoutInt1Bool8x16_1_Medium *data_x00112;
  OpLayoutUint8x16_1Float32x4_1_Small *data_x00113;
  OpLayoutInt1Bool32x4_1Int1_Medium *data_x00114;
  OpLayoutReg1Int32x4_1_Small *data_x00115;
  OpLayoutFloat32x4_IntConst4_Medium *data_x00116;
  OpLayoutLong1Reg1_Medium *data_x00117;
  OpLayoutBool32x4_1Uint32x4_2_Medium *data_x00118;
  OpLayoutWasmMemAccess_Large *data_x00119;
  OpLayoutFloat32x4_2Int4_Small *data_x00120;
  OpLayoutFloat32x4_2_Small *data_x00121;
  OpLayoutUint8x16_1Int8x16_1_Small *data_x00122;
  OpLayoutAsmReg1_Large *pOVar7;
  OpLayoutFloat2_Large *data_x00123;
  OpLayoutDouble1Const1_Small *data_x00124;
  OpLayoutFloat32x4_1Uint16x8_1_Medium *data_x00125;
  OpLayoutUint8x16_2Int1_Medium *data_x00126;
  OpLayoutInt16x8_1Int8_Small *data_x00127;
  OpLayoutFloat32x4_1Int8x16_1_Medium *data_x00128;
  OpLayoutUint8x16_1Uint16x8_1_Medium *data_x00129;
  OpLayoutBool8x16_3_Small *data_x00130;
  OpLayoutUint8x16_2_Medium *data_x00131;
  OpLayoutAsmReg18_Large *data_x00132;
  OpLayoutReg1IntConst1_Medium *data_x00133;
  OpLayoutBool8x16_1Uint8x16_2_Medium *data_x00134;
  OpLayoutAsmReg17_Large *data_x00135;
  OpLayoutInt1Double1_Large *data_x00136;
  OpLayoutInt1Bool8x16_1_Small *data_x00137;
  OpLayoutUint32x4_1Int32x4_1_Medium *data_x00138;
  OpLayoutInt8x16_2Int2_Medium *data_x00139;
  OpLayoutFloat32x4_2_Large *data_x00140;
  OpLayoutInt16x8_3_Medium *data_x00141;
  OpLayoutDouble1Float1_Large *data_x00142;
  OpLayoutLong3_Medium *data_x00143;
  OpLayoutUint32x4_1Int8x16_1_Small *data_x00144;
  OpLayoutReg1Int8x16_1_Small *data_x00145;
  OpLayoutFloat32x4_2Int1Float1_Small *data_x00146;
  OpLayoutDouble1Float1_Small *data_x00147;
  OpLayoutInt1Double2_Large *data_x00148;
  OpLayoutInt1Uint32x4_1Int1_Medium *data_x00149;
  OpLayoutInt32x4_3_Medium *data_x00150;
  OpLayoutAsmTypedArr_Small *data_x00151;
  OpLayoutUint8x16_1Int1_Medium *data_x00152;
  OpLayoutInt3_Large *data_x00153;
  OpLayoutAsmReg1_Small *pOVar8;
  OpLayoutUint16x8_2Int2_Small *data_x00154;
  OpLayoutBool32x4_1Int4_Medium *data_x00155;
  OpLayoutLong2_Large *data_x00156;
  OpLayoutInt32x4_1Uint8x16_1_Large *data_x00157;
  OpLayoutBool32x4_1Int32x4_2_Small *data_x00158;
  OpLayoutFloat64x2_2_Medium *data_x00159;
  OpLayoutFloat64x2_1Double1_Large *data_x00160;
  OpLayoutUint8x16_2Int16_Medium *data_x00161;
  OpLayoutDouble1Float64x2_1Int1_Small *data_x00162;
  OpLayoutBool16x8_2_Small *data_x00163;
  OpLayoutBrInt1Const1_Large *data_x00164;
  OpLayoutFloat32x4_2Float1_Large *data_x00165;
  OpLayoutInt32x4_2Int1_Medium *data_x00166;
  OpLayoutInt32x4_1Int8x16_1_Large *data_x00167;
  OpLayoutUint8x16_2Int16_Small *data_x00168;
  OpLayoutBool32x4_2_Medium *data_x00169;
  OpLayoutAsmReg4_Medium *data_x00170;
  OpLayoutAsmTypedArr_Large *data_x00171;
  OpLayoutBool8x16_1Int1_Small *data_x00172;
  OpLayoutWasmMemAccess_Medium *data_x00173;
  OpLayoutInt16x8_2Int2_Small *data_x00174;
  OpLayoutUint32x4_1Int1_Medium *data_x00175;
  OpLayoutDouble3_Large *data_x00176;
  OpLayoutReg1Uint16x8_1_Small *data_x00177;
  OpLayoutAsmReg5_Medium *data_x00178;
  OpLayoutProfiledAsmCall_Large *data_x00179;
  OpLayoutWasmLoopStart_Large *pOVar9;
  OpLayoutFloat1Float32x4_1Int1_Large *data_x00180;
  OpLayoutDouble2_Medium *data_x00181;
  OpLayoutInt32x4_2_Large *data_x00182;
  OpLayoutInt16x8_3Int8_Large *data_x00183;
  OpLayoutDouble2_Small *data_x00184;
  OpLayoutBool16x8_1Int16x8_2_Medium *data_x00185;
  OpLayoutInt1Bool64x2_1_Small *data_x00186;
  OpLayoutInt32x4_1Bool32x4_1Int32x4_2_Medium *data_x00187;
  OpLayoutInt32x4_2Int1_Large *data_x00188;
  OpLayoutFloat1Long1_Small *data_x00189;
  OpLayoutBool16x8_2Int2_Small *data_x00190;
  OpLayoutFloat1Double1_Large *data_x00191;
  OpLayoutInt16x8_1Uint32x4_1_Small *data_x00192;
  OpLayoutInt64x2_1Long1_Large *data_x00193;
  OpLayoutUint16x8_1Float32x4_1_Medium *data_x00194;
  OpLayoutFloat1Long1_Large *data_x00195;
  OpLayoutInt8x16_1Uint32x4_1_Large *data_x00196;
  OpLayoutBrInt1_Large *data_x00197;
  OpLayoutInt32x4_2_Medium *data_x00198;
  OpLayoutFloat32x4_2Int4_Large *data_x00199;
  OpLayoutInt1Float1_Small *data_x00200;
  OpLayoutInt32x4_1Int4_Medium *data_x00201;
  OpLayoutInt16x8_1Int1_Large *data_x00202;
  OpLayoutReg1Int32x4_1_Large *data_x00203;
  OpLayoutDouble1Long1_Large *data_x00204;
  OpLayoutInt8x16_1Int16_Medium *data_x00205;
  OpLayoutInt8x16_1Uint16x8_1_Large *data_x00206;
  OpLayoutInt8x16_2Int1_Large *data_x00207;
  OpLayoutBool16x8_1Int16x8_2_Large *data_x00208;
  OpLayoutReg1Bool8x16_1_Medium *data_x00209;
  OpLayoutUint8x16_3Int16_Medium *data_x00210;
  OpLayoutReg1Int1_Medium *data_x00211;
  OpLayoutUint16x8_1Int32x4_1_Small *data_x00212;
  OpLayoutInt8x16_1Float32x4_1_Medium *data_x00213;
  OpLayoutAsmReg11_Large *data_x00214;
  OpLayoutAsmReg19_Small *data_x00215;
  OpLayoutFloat32x4_1Int32x4_1_Medium *data_x00216;
  OpLayoutFloat32x4_3Int4_Large *data_x00217;
  OpLayoutAsmReg10_Large *data_x00218;
  OpLayoutFloat32x4_1Int32x4_1_Large *data_x00219;
  OpLayoutInt16x8_1Int8x16_1_Small *data_x00220;
  OpLayoutBool32x4_3_Small *data_x00221;
  OpLayoutInt8x16_2Int2_Small *data_x00222;
  OpLayoutUint32x4_1Int8x16_1_Medium *data_x00223;
  OpLayoutUint32x4_1Int4_Large *data_x00224;
  OpLayoutInt64x2_2_Int1_Long1_Large *data_x00225;
  OpLayoutInt8x16_3_Large *data_x00226;
  OpLayoutInt16x8_1Bool16x8_1Int16x8_2_Large *data_x00227;
  OpLayoutUint16x8_1Uint8x16_1_Medium *data_x00228;
  OpLayoutBool32x4_1Uint32x4_2_Large *data_x00229;
  OpLayoutInt32x4_1Float32x4_1_Medium *data_x00230;
  OpLayoutFloat32x4_1Uint16x8_1_Small *data_x00231;
  OpLayoutFloat32x4_1Uint32x4_1_Large *data_x00232;
  OpLayoutLong1Double1_Large *data_x00233;
  OpLayoutInt16x8_2Int8_Medium *data_x00234;
  OpLayoutUint32x4_2_Large *data_x00235;
  OpLayoutAsmReg7_Small *data_x00236;
  OpLayoutFloat32x4_1Int8x16_1_Large *data_x00237;
  OpLayoutInt16x8_1Int32x4_1_Medium *data_x00238;
  OpLayoutInt8x16_3Int16_Large *data_x00239;
  OpLayoutInt1Uint8x16_1Int1_Medium *data_x00240;
  OpLayoutAsmReg3_Medium *data_x00241;
  OpLayoutUint16x8_2Int1_Large *data_x00242;
  OpLayoutBool32x4_1Int4_Small *data_x00243;
  OpLayoutDouble2_Large *data_x00244;
  OpLayoutFloat1Int1_Medium *data_x00245;
  OpLayoutInt3_Small *data_x00246;
  OpLayoutReg1Long1_Large *data_x00247;
  OpLayoutFloat32x4_1Uint32x4_1_Medium *data_x00248;
  OpLayoutInt8x16_1Bool8x16_1Int8x16_2_Large *data_x00249;
  OpLayoutDouble1Const1_Large *data_x00250;
  OpLayoutInt16x8_2_Small *data_x00251;
  OpLayoutUint8x16_1Int16_Large *data_x00252;
  OpLayoutDouble1Const1_Medium *data_x00253;
  OpLayoutInt16x8_1Int32x4_1_Large *data_x00254;
  OpLayoutAsmSimdTypedArr_Medium *data_x00255;
  OpLayoutUint32x4_2_Medium *data_x00256;
  OpLayoutAsmReg6_Large *data_x00257;
  OpLayoutAsmReg9_Small *data_x00258;
  OpLayoutFloat32x4_1Float4_Large *data_x00259;
  OpLayoutLong1Float1_Large *data_x00260;
  OpLayoutInt16x8_2Int2_Medium *data_x00261;
  OpLayoutFloat32x4_1Uint8x16_1_Large *data_x00262;
  undefined4 *puVar10;
  OpLayoutReg1Int16x8_1_Large *data_x00263;
  OpLayoutInt8x16_2_Medium *data_x00264;
  OpLayoutInt32x4_1Bool32x4_1Int32x4_2_Large *data_x00265;
  OpLayoutInt16x8_2Int2_Large *data_x00266;
  OpLayoutInt16x8_2_Large *data_x00267;
  OpLayoutUint32x4_1Int32x4_1_Large *data_x00268;
  OpLayoutUint16x8_1Uint32x4_1_Small *data_x00269;
  OpLayoutInt16x8_1Int8_Medium *data_x00270;
  OpLayoutInt8x16_2Int2_Large *data_x00271;
  OpLayoutUint32x4_3_Large *data_x00272;
  OpLayoutUint8x16_1Int1_Large *data_x00273;
  OpLayoutUint16x8_3_Large *data_x00274;
  OpLayoutInt16x8_3_Large *data_x00275;
  OpLayoutUint16x8_1Int16x8_1_Large *data_x00276;
  OpLayoutUint16x8_3Int8_Large *data_x00277;
  OpLayoutUint32x4_2Int4_Large *data_x00278;
  OpLayoutInt32x4_1Int1_Small *data_x00279;
  OpLayoutUint8x16_3_Large *data_x00280;
  OpLayoutUint8x16_2Int2_Large *data_x00281;
  OpLayoutInt32x4_1Int1_Large *data_x00282;
  OpLayoutAsmReg1_Medium *pOVar11;
  OpLayoutUint32x4_3_Medium *data_x00283;
  OpLayoutFloat32x4_2Int1Float1_Large *data_x00284;
  OpLayoutUint32x4_1Bool32x4_1Uint32x4_2_Large *data_x00285;
  OpLayoutUint8x16_1Uint32x4_1_Large *data_x00286;
  OpLayoutBool8x16_1Uint8x16_2_Large *data_x00287;
  OpLayoutInt32x4_1Uint32x4_1_Large *data_x00288;
  OpLayoutFloat32x4_2_Medium *data_x00289;
  OpLayoutInt1Int32x4_1Int1_Large *data_x00290;
  OpLayoutBool16x8_1Int8_Large *data_x00291;
  OpLayoutFloat1Int1_Small *data_x00292;
  OpLayoutFloat32x4_1Int32x4_1_Small *data_x00293;
  OpLayoutUint32x4_1Float32x4_1_Large *data_x00294;
  OpLayoutBrInt1Const1_Small *data_x00295;
  OpLayoutInt1Double1_Small *data_x00296;
  OpLayoutInt32x4_1Float32x4_1_Small *data_x00297;
  OpLayoutBool8x16_1Int1_Medium *data_x00298;
  OpLayoutBrInt1_Medium *data_x00299;
  OpLayoutUint16x8_1Uint8x16_1_Large *data_x00300;
  OpLayoutBool16x8_2Int2_Large *data_x00301;
  OpLayoutUint8x16_1Bool8x16_1Uint8x16_2_Large *data_x00302;
  OpLayoutLong1Const1_Large *data_x00303;
  OpLayoutReg1Uint32x4_1_Medium *data_x00304;
  OpLayoutUint16x8_1Int32x4_1_Large *data_x00305;
  OpLayoutInt64x2_2Int1_Large *data_x00306;
  OpLayoutFloat2_Small *data_x00307;
  OpLayoutDouble1Int1_Large *data_x00308;
  OpLayoutDouble1Float64x2_1Int1_Medium *data_x00309;
  OpLayoutUint8x16_1Int16x8_1_Medium *data_x00310;
  OpLayoutInt16x8_1Uint8x16_1_Medium *data_x00311;
  OpLayoutInt1Uint16x8_1Int1_Large *data_x00312;
  OpLayoutInt32x4_2Int2_Large *data_x00313;
  OpLayoutInt8x16_1Uint8x16_1_Large *data_x00314;
  OpLayoutBool16x8_3_Large *data_x00315;
  OpLayoutUint16x8_2_Small *data_x00316;
  OpLayoutLong1Int64x2_1Int1_Large *data_x00317;
  OpLayoutBool16x8_1Uint16x8_2_Medium *data_x00318;
  OpLayoutInt1Double1_Medium *data_x00319;
  OpLayoutInt1Int8x16_1Int1_Large *data_x00320;
  OpLayoutUint16x8_1Float32x4_1_Large *data_x00321;
  OpLayoutBool8x16_2_Large *data_x00322;
  OpLayoutInt1Uint8x16_1Int1_Large *data_x00323;
  OpLayoutDouble1Float64x2_1Int1_Large *data_x00324;
  OpLayoutReg1Uint16x8_1_Large *data_x00325;
  OpLayoutUint32x4_1Int8x16_1_Large *data_x00326;
  OpLayoutBool16x8_2_Large *data_x00327;
  OpLayoutFloat1Int1_Large *data_x00328;
  OpLayoutBool8x16_1Int1_Large *data_x00329;
  OpLayoutBool8x16_2_Medium *data_x00330;
  OpLayoutUint32x4_2Int4_Medium *data_x00331;
  OpLayoutAsmReg5_Large *data_x00332;
  OpLayoutBool32x4_1Int1_Large *data_x00333;
  OpLayoutReg1Int1_Large *data_x00334;
  OpLayoutBool32x4_1Int4_Large *data_x00335;
  OpLayoutUint32x4_2Int4_Small *data_x00336;
  OpLayoutReg1Bool8x16_1_Large *data_x00337;
  OpLayoutFloat32x4_1Uint16x8_1_Large *data_x00338;
  OpLayoutReg1Float32x4_1_Large *data_x00339;
  OpLayoutInt1Bool16x8_1Int1_Large *data_x00340;
  OpLayoutFloat64x2_2_Large *data_x00341;
  OpLayoutUint32x4_1Uint16x8_1_Large *data_x00342;
  OpLayoutBool8x16_3_Large *data_x00343;
  OpLayoutInt1Bool8x16_1_Large *data_x00344;
  OpLayoutUint8x16_1Int16_Small *data_x00345;
  OpLayoutInt1Bool8x16_1Int1_Medium *data_x00346;
  OpLayoutInt1Uint16x8_1Int1_Small *data_x00347;
  OpLayoutBool8x16_1Int16_Small *data_x00348;
  OpLayoutAsmSimdTypedArr_Large *data_x00349;
  OpLayoutAsmShuffle_Large *data_x00350;
  OpLayoutUint32x4_1Int32x4_1_Small *data_x00351;
  OpLayoutInt16x8_2Int1_Medium *data_x00352;
  OpLayoutInt8x16_1Int1_Large *data_x00353;
  OpLayoutInt16x8_1Uint8x16_1_Large *data_x00354;
  OpLayoutUint8x16_1Float32x4_1_Large *data_x00355;
  OpLayoutReg1Int16x8_1_Medium *data_x00356;
  OpLayoutBool16x8_1Int1_Large *data_x00357;
  OpLayoutInt8x16_2Int16_Large *data_x00358;
  OpLayoutUint8x16_2_Large *data_x00359;
  OpLayoutInt16x8_1Uint8x16_1_Small *data_x00360;
  OpLayoutInt1Uint32x4_1Int1_Large *data_x00361;
  OpLayoutBool32x4_2_Large *data_x00362;
  OpLayoutUint16x8_1Int8_Large *data_x00363;
  OpLayoutBool8x16_2Int2_Large *data_x00364;
  OpLayoutUint32x4_1Int16x8_1_Large *data_x00365;
  OpLayoutUint32x4_1Uint8x16_1_Large *data_x00366;
  OpLayoutInt1Bool32x4_1_Large *data_x00367;
  OpLayoutInt1Bool16x8_1_Large *data_x00368;
  OpLayoutInt1Bool8x16_1Int1_Large *data_x00369;
  OpLayoutReg1Bool32x4_1_Large *data_x00370;
  OpLayoutReg1Bool16x8_1_Large *data_x00371;
  OpLayoutBool8x16_1Int16_Large *data_x00372;
  OpLayoutAsmReg19_Medium *data_x00373;
  OpLayoutUint8x16_1Int32x4_1_Large *data_x00374;
  OpLayoutUint8x16_2Int1_Large *data_x00375;
  OpLayoutUint8x16_1Float32x4_1_Medium *data_x00376;
  OpLayoutElementSlot_Large *data_x00377;
  OpLayoutLong1Float1_Small *data_x00378;
  OpLayoutDouble1Float1_Medium *data_x00379;
  OpLayoutUint8x16_1Uint32x4_1_Medium *data_x00380;
  OpLayoutBool8x16_2Int2_Medium *data_x00381;
  OpLayoutAsmReg7_Large *data_x00382;
  OpLayoutInt1Int32x4_1Int1_Small *data_x00383;
  OpLayoutInt1Long1_Large *data_x00384;
  OpLayoutUint32x4_1Uint16x8_1_Medium *data_x00385;
  OpLayoutUint16x8_1Uint32x4_1_Large *data_x00386;
  OpLayoutInt1Long2_Large *data_x00387;
  OpLayoutFloat32x4_1Int16x8_1_Medium *data_x00388;
  OpLayoutBool32x4_1Int32x4_2_Large *data_x00389;
  OpLayoutFloat64x2_2Int1Double1_Large *data_x00390;
  OpLayoutFloat32x4_IntConst4_Large *data_x00391;
  OpLayoutInt8x16_1Int16x8_1_Large *data_x00392;
  OpLayoutBool32x4_2Int2_Large *data_x00393;
  OpLayoutInt8x16_1Int32x4_1_Large *data_x00394;
  OpLayoutInt16x8_1Int8_Large *data_x00395;
  OpLayoutInt64x2_3_Large *data_x00396;
  OpLayoutInt1Int16x8_1Int1_Large *data_x00397;
  OpLayoutInt1Int16x8_1Int1_Medium *data_x00398;
  OpLayoutInt64x2_2Int1_Medium *data_x00399;
  OpLayoutLong1Int64x2_1Int1_Medium *data_x00400;
  OpLayoutInt64x2_2_Large *data_x00401;
  OpLayoutUint8x16_2Int16_Large *data_x00402;
  OpLayoutBool32x4_3_Large *data_x00403;
  OpLayoutUint16x8_2Int8_Large *data_x00404;
  OpLayoutReg1Uint8x16_1_Large *data_x00405;
  OpLayoutUint16x8_2_Large *data_x00406;
  OpLayoutInt1Bool32x4_1Int1_Large *data_x00407;
  OpLayoutUint8x16_1Int8x16_1_Large *data_x00408;
  OpLayoutUint8x16_1Int16x8_1_Large *data_x00409;
  OpLayoutInt1Bool64x2_1_Large *data_x00410;
  OpLayoutFloat64x2_3_Medium *data_x00411;
  OpLayoutUint8x16_3Int16_Large *data_x00412;
  OpLayoutDouble3_Medium *data_x00413;
  OpLayoutInt1Int8x16_1Int1_Small *data_x00414;
  OpLayoutInt16x8_3Int8_Medium *data_x00415;
  OpLayoutUint8x16_1Uint16x8_1_Large *data_x00416;
  OpLayoutReg1Long1_Small *data_x00417;
  OpLayoutUint8x16_2Int2_Medium *data_x00418;
  OpLayoutUint16x8_2Int2_Large *data_x00419;
  OpLayoutAsmCall_Small *data_x00420;
  OpLayoutUint32x4_1Int16x8_1_Medium *data_x00421;
  OpLayoutInt32x4_4_Large *data_x00422;
  OpLayoutInt16x8_2Int8_Large *data_x00423;
  OpLayoutInt32x4_1Float32x4_1_Large *data_x00424;
  OpLayoutUint32x4_2Int2_Large *data_x00425;
  OpLayoutUint16x8_1Int1_Large *data_x00426;
  OpLayoutUint32x4_2_Small *data_x00427;
  OpLayoutReg1Float1_Large *data_x00428;
  OpLayoutUint16x8_2_Medium *data_x00429;
  OpLayoutLong3_Large *data_x00430;
  OpLayoutFloat64x2_3_Large *data_x00431;
  OpLayoutBool16x8_1Uint16x8_2_Large *data_x00432;
  OpLayoutUint16x8_1Int8x16_1_Large *data_x00433;
  OpLayoutUint16x8_1Uint8x16_1_Small *data_x00434;
  OpLayoutUint8x16_1Int32x4_1_Small *data_x00435;
  OpLayoutUint32x4_1Int1_Large *data_x00436;
  OpLayoutFloat32x4_2Int1Float1_Medium *data_x00437;
  OpLayoutInt32x4_1Int4_Large *data_x00438;
  OpLayoutUint32x4_3Int4_Small *data_x00439;
  OpLayoutInt8x16_1Float32x4_1_Large *data_x00440;
  OpLayoutUint32x4_3Int4_Large *data_x00441;
  OpLayoutInt16x8_2Int1_Large *data_x00442;
  OpLayoutUint16x8_1Bool16x8_1Uint16x8_2_Large *data_x00443;
  OpLayoutInt16x8_1Float32x4_1_Large *data_x00444;
  OpLayoutReg1Uint32x4_1_Large *data_x00445;
  OpLayoutReg1Uint8x16_1_Small *data_x00446;
  OpLayoutInt1Uint32x4_1Int1_Small *data_x00447;
  OpLayoutInt16x8_1Int8x16_1_Large *data_x00448;
  OpLayoutInt1Float1_Large *data_x00449;
  OpLayoutFloat64x2_2Int1Double1_Medium *data_x00450;
  OpLayoutUint32x4_2Int1_Large *data_x00451;
  OpLayoutInt32x4_3Int4_Medium *data_x00452;
  OpLayoutUint8x16_3_Small *data_x00453;
  OpLayoutFloat32x4_1Int16x8_1_Large *data_x00454;
  OpLayoutInt2_Small *data_x00455;
  OpLayoutInt8x16_1Int16_Large *data_x00456;
  OpLayoutFloat1Reg1_Large *data_x00457;
  OpLayoutInt8x16_1Uint32x4_1_Medium *data_x00458;
  OpLayoutUint8x16_1Int16_Medium *data_x00459;
  OpLayoutBool16x8_1Int8_Small *data_x00460;
  OpLayoutInt16x8_1Uint32x4_1_Large *data_x00461;
  OpLayoutInt8x16_1Int32x4_1_Medium *data_x00462;
  OpLayoutDouble1Reg1_Large *data_x00463;
  OpLayoutInt8x16_1Int16x8_1_Small *data_x00464;
  OpLayoutInt1Double2_Small *data_x00465;
  OpLayoutWasmLoopStart_Small *pOVar12;
  OpLayoutReg1Float32x4_1_Medium *data_x00466;
  OpLayoutInt32x4_1Int16x8_1_Large *data_x00467;
  OpLayoutUint16x8_2Int8_Medium *data_x00468;
  OpLayoutReg1Int8x16_1_Large *data_x00469;
  OpLayoutBool8x16_1Int8x16_2_Large *data_x00470;
  OpLayoutInt32x4_2Int4_Large *data_x00471;
  OpLayoutReg1IntConst1_Large *data_x00472;
  OpLayoutInt1Const1_Large *data_x00473;
  OpLayoutDouble1Long1_Medium *data_x00474;
  OpLayoutUint32x4_1Float32x4_1_Medium *data_x00475;
  OpLayoutInt32x4_3_Large *data_x00476;
  OpLayoutUint32x4_2Int2_Small *data_x00477;
  OpLayoutInt8x16_2_Large *data_x00478;
  OpLayoutInt32x4_3Int4_Small *data_x00479;
  OpLayoutInt1Long2_Medium *data_x00480;
  OpLayoutReg1Double1_Large *data_x00481;
  OpLayoutLong1Int1_Large *data_x00482;
  OpLayoutLong2_Medium *data_x00483;
  OpLayoutFloat32x4_1Bool32x4_1Float32x4_2_Large *data_x00484;
  OpLayoutInt1Reg1_Large *data_x00485;
  OpLayoutUint32x4_3Int4_Medium *data_x00486;
  OpLayoutInt32x4_1Uint16x8_1_Large *data_x00487;
  OpLayoutInt16x8_1Uint16x8_1_Large *data_x00488;
  OpLayoutBool32x4_1Int1_Small *data_x00489;
  OpLayoutInt1Bool16x8_1Int1_Small *data_x00490;
  OpLayoutInt64x2_3_Medium *data_x00491;
  OpLayoutInt16x8_1Uint16x8_1_Medium *data_x00492;
  OpLayoutInt2_Large *data_x00493;
  OpLayoutBool16x8_2_Medium *data_x00494;
  OpLayoutFloat32x4_3Int4_Medium *data_x00495;
  OpLayoutUint16x8_2Int8_Small *data_x00496;
  OpLayoutBrInt2_Large *data_x00497;
  OpLayoutInt8x16_3_Medium *data_x00498;
  OpLayoutInt32x4_1Int16x8_1_Medium *data_x00499;
  OpLayoutLong1Reg1_Large *data_x00500;
  OpLayoutUint32x4_1Float32x4_1_Small *data_x00501;
  OpLayoutBool16x8_1Int8_Medium *data_x00502;
  OpLayoutInt1Bool32x4_1_Medium *data_x00503;
  OpLayoutFloat3_Large *data_x00504;
  OpLayoutInt1Float2_Large *data_x00505;
  OpLayoutUint16x8_1Int1_Medium *data_x00506;
  OpLayoutFloat1Reg1_Medium *data_x00507;
  OpLayoutBool8x16_1Int16_Medium *data_x00508;
  OpLayoutFloat1Const1_Large *data_x00509;
  OpLayoutAsmReg9_Large *data_x00510;
  OpLayoutInt32x4_3Int4_Large *data_x00511;
  OpLayoutAsmReg2_Large *data_x00512;
  OpLayoutInt8x16_2Int16_Medium *data_x00513;
  OpLayoutFloat32x4_4_Large *data_x00514;
  OpLayoutInt16x8_1Float32x4_1_Medium *data_x00515;
  OpLayoutInt1Float2_Small *data_x00516;
  OpLayoutInt32x4_1Uint32x4_1_Small *data_x00517;
  OpLayoutFloat32x4_1Float1_Large *data_x00518;
  OpLayoutInt8x16_2Int1_Medium *data_x00519;
  OpLayoutUint32x4_1Int4_Small *data_x00520;
  OpLayoutUint32x4_1Uint8x16_1_Medium *data_x00521;
  OpLayoutFloat32x4_IntConst4_Small *data_x00522;
  OpLayoutAsmReg19_Large *data_x00523;
  OpLayoutBool32x4_3_Medium *data_x00524;
  OpLayoutBool32x4_1Float32x4_2_Large *data_x00525;
  OpLayoutBool32x4_2Int2_Medium *data_x00526;
  OpLayoutInt64x2_3_Small *data_x00527;
  OpLayoutFloat32x4_3_Large *data_x00528;
  OpLayoutInt16x8_1Int8x16_1_Medium *data_x00529;
  OpLayoutInt16x8_1Bool16x8_1Int16x8_2_Medium *data_x00530;
  OpLayoutInt8x16_1Uint8x16_1_Medium *data_x00531;
  OpLayoutReg1Bool16x8_1_Small *data_x00532;
  OpLayoutInt16x8_1Int32x4_1_Small *data_x00533;
  OpLayoutAsmShuffle_Medium *data_x00534;
  OpLayoutInt1Bool32x4_1_Small *data_x00535;
  OpLayoutUint16x8_1Bool16x8_1Uint16x8_2_Medium *data_x00536;
  OpLayoutReg1Int16x8_1_Small *data_x00537;
  OpLayoutInt1Bool16x8_1Int1_Medium *data_x00538;
  OpLayoutAsmReg3_Large *data_x00539;
  OpLayoutAsmReg18_Medium *data_x00540;
  OpLayoutAsmReg4_Large *data_x00541;
  OpLayoutUint32x4_1Uint16x8_1_Small *data_x00542;
  OpLayoutUint8x16_1Int1_Small *data_x00543;
  OpLayoutReg1Bool32x4_1_Medium *data_x00544;
  OpLayoutInt16x8_1Uint32x4_1_Medium *data_x00545;
  OpLayoutInt1Bool64x2_1_Medium *data_x00546;
  OpLayoutDouble1Reg1_Small *data_x00547;
  OpLayoutUint32x4_1Bool32x4_1Uint32x4_2_Medium *data_x00548;
  OpLayoutAsmReg17_Medium *data_x00549;
  OpLayoutInt1Uint16x8_1Int1_Medium *data_x00550;
  OpLayoutBool8x16_3_Medium *data_x00551;
  OpLayoutElementSlot_Medium *data_x00552;
  OpLayoutInt64x2_1Long1_Medium *data_x00553;
  OpLayoutInt64x2_2_Medium *data_x00554;
  OpLayoutInt32x4_1Uint32x4_1_Medium *data_x00555;
  OpLayoutReg1Bool16x8_1_Medium *data_x00556;
  OpLayoutBool8x16_1Int8x16_2_Medium *data_x00557;
  OpLayoutBrInt2_Medium *data_x00558;
  OpLayoutFloat1Double1_Medium *data_x00559;
  OpLayoutReg1Float32x4_1_Small *data_x00560;
  OpLayoutBool8x16_1Int8x16_2_Small *data_x00561;
  OpLayoutBrInt1_Small *data_x00562;
  OpLayoutBool32x4_2Int2_Small *data_x00563;
  OpLayoutInt1Double2_Medium *data_x00564;
  OpLayoutReg1Int8x16_1_Medium *data_x00565;
  OpLayoutInt1Bool32x4_1Int1_Small *data_x00566;
  OpLayoutBool16x8_1Int16x8_2_Small *data_x00567;
  OpLayoutReg1Bool32x4_1_Small *data_x00568;
  OpLayoutBool16x8_1Int1_Medium *data_x00569;
  OpLayoutReg1Uint16x8_1_Medium *data_x00570;
  OpLayoutUint16x8_1Int32x4_1_Medium *data_x00571;
  OpLayoutInt32x4_2Int2_Small *data_x00572;
  OpLayoutUint8x16_3_Medium *data_x00573;
  OpLayoutInt8x16_1Int32x4_1_Small *data_x00574;
  OpLayoutUint16x8_3Int8_Medium *data_x00575;
  OpLayoutInt2_Medium *data_x00576;
  OpLayoutBrInt1Const1_Medium *data_x00577;
  OpLayoutUint16x8_1Uint32x4_1_Medium *data_x00578;
  OpLayoutFloat2_Medium *data_x00579;
  OpLayoutInt1Float2_Medium *data_x00580;
  OpLayoutUint16x8_1Int8x16_1_Medium *data_x00581;
  OpLayoutUint8x16_1Bool8x16_1Uint8x16_2_Medium *data_x00582;
  OpLayoutUint16x8_3_Medium *data_x00583;
  OpLayoutProfiledAsmCall_Medium *data_x00584;
  OpLayoutAsmReg6_Medium *data_x00585;
  OpLayoutInt8x16_1Int16x8_1_Medium *data_x00586;
  OpLayoutUint32x4_1Int4_Medium *data_x00587;
  OpLayoutInt8x16_1Bool8x16_1Int8x16_2_Medium *data_x00588;
  OpLayoutInt8x16_1Uint8x16_1_Small *data_x00589;
  OpLayoutUint16x8_1Int8_Medium *data_x00590;
  OpLayoutAsmReg10_Medium *data_x00591;
  OpLayoutBool32x4_1Float32x4_2_Medium *data_x00592;
  OpLayoutInt8x16_3Int16_Medium *data_x00593;
  OpLayoutFloat1Float32x4_1Int1_Small *data_x00594;
  OpLayoutFloat32x4_2Float1_Medium *data_x00595;
  OpLayoutInt16x8_1Uint16x8_1_Small *data_x00596;
  OpLayoutInt16x8_1Int1_Medium *data_x00597;
  OpLayoutUint16x8_3_Small *data_x00598;
  OpLayoutInt16x8_2_Medium *data_x00599;
  OpLayoutInt32x4_1Uint16x8_1_Medium *data_x00600;
  OpLayoutInt1Int32x4_1Int1_Medium *data_x00601;
  OpLayoutReg1Int32x4_1_Medium *data_x00602;
  OpLayoutAsmReg5_Small *data_x00603;
  OpLayoutInt64x2_2Int1_Small *data_x00604;
  OpLayoutFloat32x4_1Uint32x4_1_Small *data_x00605;
  OpLayoutFloat32x4_2Int4_Medium *data_x00606;
  OpLayoutBrInt2_Small *data_x00607;
  OpLayoutInt32x4_1Bool32x4_1Int32x4_2_Small *data_x00608;
  OpLayoutInt1Uint8x16_1Int1_Small *data_x00609;
  OpLayoutUint8x16_2Int1_Small *data_x00610;
  OpLayoutInt32x4_2Int4_Medium *data_x00611;
  OpLayoutUint8x16_1Int16x8_1_Small *data_x00612;
  OpLayoutBool8x16_2_Small *data_x00613;
  OpLayoutUint16x8_1Float32x4_1_Small *data_x00614;
  OpLayoutInt1Long2_Small *data_x00615;
  OpLayoutInt8x16_2Int1_Small *data_x00616;
  OpLayoutAsmShuffle_Small *data_x00617;
  OpLayoutAsmReg2_Small *data_x00618;
  OpLayoutUint8x16_2Int2_Small *data_x00619;
  OpLayoutBool32x4_2_Small *data_x00620;
  OpLayoutInt32x4_2Int2_Medium *data_x00621;
  OpLayoutLong1Int1_Small *data_x00622;
  OpLayoutUint8x16_1Bool8x16_1Uint8x16_2_Small *data_x00623;
  OpLayoutFloat3_Medium *data_x00624;
  OpLayoutAsmCall_Medium *data_x00625;
  OpLayoutDouble1Long1_Small *data_x00626;
  OpLayoutInt8x16_1Int1_Small *data_x00627;
  OpLayoutDouble1Reg1_Medium *data_x00628;
  OpLayoutInt32x4_2_Small *data_x00629;
  OpLayoutFloat3_Small *data_x00630;
  OpLayoutUint16x8_1Int1_Small *data_x00631;
  OpLayoutReg1Double1_Medium *data_x00632;
  OpLayoutLong1Double1_Medium *data_x00633;
  OpLayoutUint32x4_1Int1_Small *data_x00634;
  OpLayoutInt32x4_1Int16x8_1_Small *data_x00635;
  OpLayoutAsmReg7_Medium *data_x00636;
  OpLayoutUint16x8_1Bool16x8_1Uint16x8_2_Small *data_x00637;
  OpLayoutFloat32x4_4_Small *data_x00638;
  OpLayoutReg1Bool8x16_1_Small *data_x00639;
  OpLayoutUint8x16_2_Small *data_x00640;
  OpLayoutInt16x8_3_Small *data_x00641;
  OpLayoutInt1Const1_Medium *data_x00642;
  OpLayoutAsmReg17_Small *data_x00643;
  OpLayoutAsmReg4_Small *data_x00644;
  OpLayoutInt8x16_2_Small *data_x00645;
  OpLayoutFloat32x4_1Float1_Small *data_x00646;
  OpLayoutInt32x4_1Int8x16_1_Small *data_x00647;
  OpLayoutUint32x4_3_Small *data_x00648;
  OpLayoutInt64x2_1Long1_Small *data_x00649;
  OpLayoutBool32x4_1Float32x4_2_Small *data_x00650;
  OpLayoutUint8x16_1Uint16x8_1_Small *data_x00651;
  OpLayoutUint8x16_3Int16_Small *data_x00652;
  OpLayoutInt8x16_1Uint32x4_1_Small *data_x00653;
  OpLayoutReg1Float1_Small *data_x00654;
  OpLayoutInt1Int16x8_1Int1_Small *data_x00655;
  OpLayoutInt8x16_1Uint16x8_1_Small *data_x00656;
  OpLayoutInt1Const1_Small *data_x00657;
  OpLayoutFloat64x2_3_Small *data_x00658;
  OpLayoutInt16x8_1Float32x4_1_Small *data_x00659;
  OpLayoutInt8x16_1Bool8x16_1Int8x16_2_Small *data_x00660;
  OpLayoutProfiledAsmCall_Small *data_x00661;
  OpLayoutFloat64x2_2_Small *data_x00662;
  OpLayoutUint16x8_3Int8_Small *data_x00663;
  OpLayoutInt32x4_1Uint8x16_1_Small *data_x00664;
  OpLayoutAsmReg6_Small *data_x00665;
  OpLayoutInt64x2_2_Int1_Long1_Small *data_x00666;
  OpLayoutInt1Reg1_Small *data_x00667;
  OpLayoutAsmReg10_Small *data_x00668;
  uint uVar13;
  char *reader_00;
  FunctionBody *dumpFunction_00;
  UnsignedType value;
  
  pcVar4 = OpCodeUtilAsmJs::GetOpCodeName(op);
  Output::Print(L"%-20s",pcVar4);
  OVar3 = OpCodeUtilAsmJs::GetOpCodeLayout(op);
  uVar13 = layoutSize * 0xe5 + OVar3._value;
  if (0x2ae < uVar13) {
switchD_0072dd5e_caseD_e6:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                ,0x11d,"(false)","Unknown OpLayout");
    if (bVar2) {
      *puVar10 = 0;
      return;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  reader_00 = (char *)((long)&switchD_0072dd5e::switchdataD_00ef5b24 +
                      (long)(int)(&switchD_0072dd5e::switchdataD_00ef5b24)[uVar13]);
  switch(uVar13) {
  case 0:
    data = ByteCodeReader::ElementSlot_Small(reader);
    DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data,dumpFunction,reader);
    return;
  case 1:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      reader_00 = "layoutSize == SmallLayout";
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                  ,0x82,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
LAB_00733881:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar10 = 0;
    }
    data_69 = ByteCodeReader::StartCall(reader);
    DumpStartCall(op,data_69,dumpFunction_00,(ByteCodeReader *)reader_00);
    return;
  case 2:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                  ,0x83,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_00733881;
      *puVar10 = 0;
    }
    ByteCodeReader::Empty(reader);
    return;
  case 3:
    data_x00151 = ByteCodeReader::AsmTypedArr_Small(reader);
    DumpAsmTypedArr<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00151,dumpFunction,reader);
    return;
  case 4:
    data_03 = ByteCodeReader::WasmMemAccess_Small(reader);
    DumpWasmMemAccess<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_03,dumpFunction,reader);
    return;
  case 5:
    data_x00420 = ByteCodeReader::AsmCall_Small(reader);
    DumpAsmCall<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00420,dumpFunction,reader);
    return;
  case 6:
    data_x00661 = ByteCodeReader::ProfiledAsmCall_Small(reader);
    DumpProfiledAsmCall<Js::OpLayoutDynamicProfile<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>__unaligned>
              (op,data_x00661,dumpFunction,reader);
    return;
  case 7:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                  ,0x88,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_00733881;
      *puVar10 = 0;
    }
    pOVar5 = ByteCodeReader::AsmBr(reader);
    ByteCodeDumper::DumpOffset(pOVar5->RelativeJumpOffset,reader);
    return;
  case 8:
    pOVar8 = ByteCodeReader::AsmReg1_Small(reader);
    ByteCodeDumper::DumpReg(pOVar8->R0);
    return;
  case 9:
    data_x00618 = ByteCodeReader::AsmReg2_Small(reader);
    DumpAsmReg2<Js::OpLayoutT_AsmReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00618,dumpFunction,reader);
    return;
  case 10:
    data_27 = ByteCodeReader::AsmReg3_Small(reader);
    DumpAsmReg3<Js::OpLayoutT_AsmReg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_27,dumpFunction,reader);
    return;
  case 0xb:
    data_x00644 = ByteCodeReader::AsmReg4_Small(reader);
    DumpAsmReg4<Js::OpLayoutT_AsmReg4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00644,dumpFunction,reader);
    return;
  case 0xc:
    data_x00603 = ByteCodeReader::AsmReg5_Small(reader);
    DumpAsmReg5<Js::OpLayoutT_AsmReg5<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00603,dumpFunction,reader);
    return;
  case 0xd:
    data_x00665 = ByteCodeReader::AsmReg6_Small(reader);
    DumpAsmReg6<Js::OpLayoutT_AsmReg6<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00665,dumpFunction,reader);
    return;
  case 0xe:
    data_x00236 = ByteCodeReader::AsmReg7_Small(reader);
    DumpAsmReg7<Js::OpLayoutT_AsmReg7<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00236,dumpFunction,reader);
    return;
  case 0xf:
    data_x00258 = ByteCodeReader::AsmReg9_Small(reader);
    DumpAsmReg9<Js::OpLayoutT_AsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00258,dumpFunction,reader);
    return;
  case 0x10:
    data_x00668 = ByteCodeReader::AsmReg10_Small(reader);
    DumpAsmReg10<Js::OpLayoutT_AsmReg10<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00668,dumpFunction,reader);
    return;
  case 0x11:
    data_09 = ByteCodeReader::AsmReg11_Small(reader);
    DumpAsmReg11<Js::OpLayoutT_AsmReg11<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_09,dumpFunction,reader);
    return;
  case 0x12:
    data_x00643 = ByteCodeReader::AsmReg17_Small(reader);
    DumpAsmReg17<Js::OpLayoutT_AsmReg17<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00643,dumpFunction,reader);
    return;
  case 0x13:
    data_55 = ByteCodeReader::AsmReg18_Small(reader);
    DumpAsmReg18<Js::OpLayoutT_AsmReg18<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_55,dumpFunction,reader);
    return;
  case 0x14:
    data_x00215 = ByteCodeReader::AsmReg19_Small(reader);
    DumpAsmReg19<Js::OpLayoutT_AsmReg19<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00215,dumpFunction,reader);
    return;
  case 0x15:
    data_x00296 = ByteCodeReader::Int1Double1_Small(reader);
    DumpInt1Double1<Js::OpLayoutT_Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00296,dumpFunction,reader);
    return;
  case 0x16:
    data_x00200 = ByteCodeReader::Int1Float1_Small(reader);
    DumpInt1Float1<Js::OpLayoutT_Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00200,dumpFunction,reader);
    return;
  case 0x17:
    data_x00124 = ByteCodeReader::Double1Const1_Small(reader);
    DumpDouble1Const1<Js::OpLayoutT_Double1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00124,dumpFunction,reader);
    return;
  case 0x18:
    data_96 = ByteCodeReader::Double1Int1_Small(reader);
    DumpDouble1Int1<Js::OpLayoutT_Double1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_96,dumpFunction,reader);
    return;
  case 0x19:
    data_x00147 = ByteCodeReader::Double1Float1_Small(reader);
    DumpDouble1Float1<Js::OpLayoutT_Double1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00147,dumpFunction,reader);
    return;
  case 0x1a:
    data_x00547 = ByteCodeReader::Double1Reg1_Small(reader);
    DumpDouble1Reg1<Js::OpLayoutT_Double1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00547,dumpFunction,reader);
    return;
  case 0x1b:
    data_20 = ByteCodeReader::Float1Reg1_Small(reader);
    DumpFloat1Reg1<Js::OpLayoutT_Float1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_20,dumpFunction,reader);
    return;
  case 0x1c:
    data_x00667 = ByteCodeReader::Int1Reg1_Small(reader);
    DumpInt1Reg1<Js::OpLayoutT_Int1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00667,dumpFunction,reader);
    return;
  case 0x1d:
    data_29 = ByteCodeReader::Reg1Double1_Small(reader);
    DumpReg1Double1<Js::OpLayoutT_Reg1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_29,dumpFunction,reader);
    return;
  case 0x1e:
    data_x00654 = ByteCodeReader::Reg1Float1_Small(reader);
    DumpReg1Float1<Js::OpLayoutT_Reg1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00654,dumpFunction,reader);
    return;
  case 0x1f:
    data_04 = ByteCodeReader::Reg1Int1_Small(reader);
    DumpReg1Int1<Js::OpLayoutT_Reg1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_04,dumpFunction,reader);
    return;
  case 0x20:
    data_x00657 = ByteCodeReader::Int1Const1_Small(reader);
    DumpInt1Const1<Js::OpLayoutT_Int1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00657,dumpFunction,reader);
    return;
  case 0x21:
    data_x00106 = ByteCodeReader::Reg1IntConst1_Small(reader);
    DumpReg1IntConst1<Js::OpLayoutT_Reg1IntConst1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00106,dumpFunction,reader);
    return;
  case 0x22:
    data_x00465 = ByteCodeReader::Int1Double2_Small(reader);
    DumpInt1Double2<Js::OpLayoutT_Int1Double2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00465,dumpFunction,reader);
    return;
  case 0x23:
    data_x00516 = ByteCodeReader::Int1Float2_Small(reader);
    DumpInt1Float2<Js::OpLayoutT_Int1Float2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00516,dumpFunction,reader);
    return;
  case 0x24:
    data_x00455 = ByteCodeReader::Int2_Small(reader);
    DumpInt2<Js::OpLayoutT_Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00455,dumpFunction,reader);
    return;
  case 0x25:
    data_x00246 = ByteCodeReader::Int3_Small(reader);
    DumpInt3<Js::OpLayoutT_Int3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00246,dumpFunction,reader);
    return;
  case 0x26:
    data_x00184 = ByteCodeReader::Double2_Small(reader);
    DumpDouble2<Js::OpLayoutT_Double2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00184,dumpFunction,reader);
    return;
  case 0x27:
    data_x00307 = ByteCodeReader::Float2_Small(reader);
    DumpFloat2<Js::OpLayoutT_Float2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00307,dumpFunction,reader);
    return;
  case 0x28:
    data_x00630 = ByteCodeReader::Float3_Small(reader);
    DumpFloat3<Js::OpLayoutT_Float3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00630,dumpFunction,reader);
    return;
  case 0x29:
    data_84 = ByteCodeReader::Float1Const1_Small(reader);
    DumpFloat1Const1<Js::OpLayoutT_Float1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_84,dumpFunction,reader);
    return;
  case 0x2a:
    data_34 = ByteCodeReader::Float1Double1_Small(reader);
    DumpFloat1Double1<Js::OpLayoutT_Float1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_34,dumpFunction,reader);
    return;
  case 0x2b:
    data_x00292 = ByteCodeReader::Float1Int1_Small(reader);
    DumpFloat1Int1<Js::OpLayoutT_Float1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00292,dumpFunction,reader);
    return;
  case 0x2c:
    data_79 = ByteCodeReader::Double3_Small(reader);
    DumpDouble3<Js::OpLayoutT_Double3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_79,dumpFunction,reader);
    return;
  case 0x2d:
    data_x00562 = ByteCodeReader::BrInt1_Small(reader);
    DumpBrInt1<Js::OpLayoutT_BrInt1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00562,dumpFunction,reader);
    return;
  case 0x2e:
    data_x00607 = ByteCodeReader::BrInt2_Small(reader);
    DumpBrInt2<Js::OpLayoutT_BrInt2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00607,dumpFunction,reader);
    return;
  case 0x2f:
    data_x00295 = ByteCodeReader::BrInt1Const1_Small(reader);
    DumpBrInt1Const1<Js::OpLayoutT_BrInt1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00295,dumpFunction,reader);
    return;
  case 0x30:
    pOVar12 = (OpLayoutWasmLoopStart_Small *)ByteCodeReader::AsmUnsigned1_Small(reader);
    break;
  case 0x31:
    pOVar12 = ByteCodeReader::WasmLoopStart_Small(reader);
    break;
  case 0x32:
    data_01 = ByteCodeReader::Long1Reg1_Small(reader);
    DumpLong1Reg1<Js::OpLayoutT_Long1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_01,dumpFunction,reader);
    return;
  case 0x33:
    data_x00417 = ByteCodeReader::Reg1Long1_Small(reader);
    DumpReg1Long1<Js::OpLayoutT_Reg1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00417,dumpFunction,reader);
    return;
  case 0x34:
    data_32 = ByteCodeReader::Long1Const1_Small(reader);
    DumpLong1Const1<Js::OpLayoutT_Long1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_32,dumpFunction,reader);
    return;
  case 0x35:
    data_05 = ByteCodeReader::Long2_Small(reader);
    DumpLong2<Js::OpLayoutT_Long2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_05,dumpFunction,reader);
    return;
  case 0x36:
    data_37 = ByteCodeReader::Long3_Small(reader);
    DumpLong3<Js::OpLayoutT_Long3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_37,dumpFunction,reader);
    return;
  case 0x37:
    data_x00615 = ByteCodeReader::Int1Long2_Small(reader);
    DumpInt1Long2<Js::OpLayoutT_Int1Long2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00615,dumpFunction,reader);
    return;
  case 0x38:
    data_x00622 = ByteCodeReader::Long1Int1_Small(reader);
    DumpLong1Int1<Js::OpLayoutT_Long1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00622,dumpFunction,reader);
    return;
  case 0x39:
    data_97 = ByteCodeReader::Int1Long1_Small(reader);
    DumpInt1Long1<Js::OpLayoutT_Int1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_97,dumpFunction,reader);
    return;
  case 0x3a:
    data_x00378 = ByteCodeReader::Long1Float1_Small(reader);
    DumpLong1Float1<Js::OpLayoutT_Long1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00378,dumpFunction,reader);
    return;
  case 0x3b:
    data_x00189 = ByteCodeReader::Float1Long1_Small(reader);
    DumpFloat1Long1<Js::OpLayoutT_Float1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00189,dumpFunction,reader);
    return;
  case 0x3c:
    data_23 = ByteCodeReader::Long1Double1_Small(reader);
    DumpLong1Double1<Js::OpLayoutT_Long1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_23,dumpFunction,reader);
    return;
  case 0x3d:
    data_x00626 = ByteCodeReader::Double1Long1_Small(reader);
    DumpDouble1Long1<Js::OpLayoutT_Double1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00626,dumpFunction,reader);
    return;
  case 0x3e:
    data_x00121 = ByteCodeReader::Float32x4_2_Small(reader);
    DumpFloat32x4_2<Js::OpLayoutT_Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00121,dumpFunction,reader);
    return;
  case 0x3f:
    data_00 = ByteCodeReader::Float32x4_3_Small(reader);
    DumpFloat32x4_3<Js::OpLayoutT_Float32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_00,dumpFunction,reader);
    return;
  case 0x40:
    data_x00638 = ByteCodeReader::Float32x4_4_Small(reader);
    DumpFloat32x4_4<Js::OpLayoutT_Float32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00638,dumpFunction,reader);
    return;
  case 0x41:
    data_x00650 = ByteCodeReader::Bool32x4_1Float32x4_2_Small(reader);
    DumpBool32x4_1Float32x4_2<Js::OpLayoutT_Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00650,dumpFunction,reader);
    return;
  case 0x42:
    data_60 = ByteCodeReader::Float32x4_1Bool32x4_1Float32x4_2_Small(reader);
    DumpFloat32x4_1Bool32x4_1Float32x4_2<Js::OpLayoutT_Float32x4_1Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_60,dumpFunction,reader);
    return;
  case 0x43:
    data_07 = ByteCodeReader::Float32x4_1Float4_Small(reader);
    DumpFloat32x4_1Float4<Js::OpLayoutT_Float32x4_1Float4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_07,dumpFunction,reader);
    return;
  case 0x44:
    data_x00120 = ByteCodeReader::Float32x4_2Int4_Small(reader);
    DumpFloat32x4_2Int4<Js::OpLayoutT_Float32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00120,dumpFunction,reader);
    return;
  case 0x45:
    data_66 = ByteCodeReader::Float32x4_3Int4_Small(reader);
    DumpFloat32x4_3Int4<Js::OpLayoutT_Float32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_66,dumpFunction,reader);
    return;
  case 0x46:
    data_x00646 = ByteCodeReader::Float32x4_1Float1_Small(reader);
    DumpFloat32x4_1Float1<Js::OpLayoutT_Float32x4_1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00646,dumpFunction,reader);
    return;
  case 0x47:
    data_59 = ByteCodeReader::Float32x4_2Float1_Small(reader);
    DumpFloat32x4_2Float1<Js::OpLayoutT_Float32x4_2Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_59,dumpFunction,reader);
    return;
  case 0x48:
    data_x00293 = ByteCodeReader::Float32x4_1Int32x4_1_Small(reader);
    DumpFloat32x4_1Int32x4_1<Js::OpLayoutT_Float32x4_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00293,dumpFunction,reader);
    return;
  case 0x49:
    data_x00605 = ByteCodeReader::Float32x4_1Uint32x4_1_Small(reader);
    DumpFloat32x4_1Uint32x4_1<Js::OpLayoutT_Float32x4_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00605,dumpFunction,reader);
    return;
  case 0x4a:
    data_02 = ByteCodeReader::Float32x4_1Int16x8_1_Small(reader);
    DumpFloat32x4_1Int16x8_1<Js::OpLayoutT_Float32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_02,dumpFunction,reader);
    return;
  case 0x4b:
    data_x00231 = ByteCodeReader::Float32x4_1Uint16x8_1_Small(reader);
    DumpFloat32x4_1Uint16x8_1<Js::OpLayoutT_Float32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00231,dumpFunction,reader);
    return;
  case 0x4c:
    data_30 = ByteCodeReader::Float32x4_1Int8x16_1_Small(reader);
    DumpFloat32x4_1Int8x16_1<Js::OpLayoutT_Float32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_30,dumpFunction,reader);
    return;
  case 0x4d:
    data_44 = ByteCodeReader::Float32x4_1Uint8x16_1_Small(reader);
    DumpFloat32x4_1Uint8x16_1<Js::OpLayoutT_Float32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_44,dumpFunction,reader);
    return;
  case 0x4e:
    data_x00560 = ByteCodeReader::Reg1Float32x4_1_Small(reader);
    DumpReg1Float32x4_1<Js::OpLayoutT_Reg1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00560,dumpFunction,reader);
    return;
  case 0x4f:
    data_x00594 = ByteCodeReader::Float1Float32x4_1Int1_Small(reader);
    DumpFloat1Float32x4_1Int1<Js::OpLayoutT_Float1Float32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00594,dumpFunction,reader);
    return;
  case 0x50:
    data_x00146 = ByteCodeReader::Float32x4_2Int1Float1_Small(reader);
    DumpFloat32x4_2Int1Float1<Js::OpLayoutT_Float32x4_2Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00146,dumpFunction,reader);
    return;
  case 0x51:
    data_x00629 = ByteCodeReader::Int32x4_2_Small(reader);
    DumpInt32x4_2<Js::OpLayoutT_Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00629,dumpFunction,reader);
    return;
  case 0x52:
    data_06 = ByteCodeReader::Int32x4_3_Small(reader);
    DumpInt32x4_3<Js::OpLayoutT_Int32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_06,dumpFunction,reader);
    return;
  case 0x53:
    data_41 = ByteCodeReader::Int32x4_4_Small(reader);
    DumpInt32x4_4<Js::OpLayoutT_Int32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_41,dumpFunction,reader);
    return;
  case 0x54:
    data_x00158 = ByteCodeReader::Bool32x4_1Int32x4_2_Small(reader);
    DumpBool32x4_1Int32x4_2<Js::OpLayoutT_Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00158,dumpFunction,reader);
    return;
  case 0x55:
    data_x00608 = ByteCodeReader::Int32x4_1Bool32x4_1Int32x4_2_Small(reader);
    DumpInt32x4_1Bool32x4_1Int32x4_2<Js::OpLayoutT_Int32x4_1Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00608,dumpFunction,reader);
    return;
  case 0x56:
    data_x00100 = ByteCodeReader::Int32x4_1Int4_Small(reader);
    DumpInt32x4_1Int4<Js::OpLayoutT_Int32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00100,dumpFunction,reader);
    return;
  case 0x57:
    data_57 = ByteCodeReader::Int32x4_2Int4_Small(reader);
    DumpInt32x4_2Int4<Js::OpLayoutT_Int32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_57,dumpFunction,reader);
    return;
  case 0x58:
    data_x00479 = ByteCodeReader::Int32x4_3Int4_Small(reader);
    DumpInt32x4_3Int4<Js::OpLayoutT_Int32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00479,dumpFunction,reader);
    return;
  case 0x59:
    data_x00279 = ByteCodeReader::Int32x4_1Int1_Small(reader);
    DumpInt32x4_1Int1<Js::OpLayoutT_Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00279,dumpFunction,reader);
    return;
  case 0x5a:
    data_08 = ByteCodeReader::Int32x4_2Int1_Small(reader);
    DumpInt32x4_2Int1<Js::OpLayoutT_Int32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_08,dumpFunction,reader);
    return;
  case 0x5b:
    data_x00115 = ByteCodeReader::Reg1Int32x4_1_Small(reader);
    DumpReg1Int32x4_1<Js::OpLayoutT_Reg1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00115,dumpFunction,reader);
    return;
  case 0x5c:
    data_x00297 = ByteCodeReader::Int32x4_1Float32x4_1_Small(reader);
    DumpInt32x4_1Float32x4_1<Js::OpLayoutT_Int32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00297,dumpFunction,reader);
    return;
  case 0x5d:
    data_x00517 = ByteCodeReader::Int32x4_1Uint32x4_1_Small(reader);
    DumpInt32x4_1Uint32x4_1<Js::OpLayoutT_Int32x4_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00517,dumpFunction,reader);
    return;
  case 0x5e:
    data_x00635 = ByteCodeReader::Int32x4_1Int16x8_1_Small(reader);
    DumpInt32x4_1Int16x8_1<Js::OpLayoutT_Int32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00635,dumpFunction,reader);
    return;
  case 0x5f:
    data_51 = ByteCodeReader::Int32x4_1Uint16x8_1_Small(reader);
    DumpInt32x4_1Uint16x8_1<Js::OpLayoutT_Int32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_51,dumpFunction,reader);
    return;
  case 0x60:
    data_x00647 = ByteCodeReader::Int32x4_1Int8x16_1_Small(reader);
    DumpInt32x4_1Int8x16_1<Js::OpLayoutT_Int32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00647,dumpFunction,reader);
    return;
  case 0x61:
    data_x00664 = ByteCodeReader::Int32x4_1Uint8x16_1_Small(reader);
    DumpInt32x4_1Uint8x16_1<Js::OpLayoutT_Int32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00664,dumpFunction,reader);
    return;
  case 0x62:
    data_x00383 = ByteCodeReader::Int1Int32x4_1Int1_Small(reader);
    DumpInt1Int32x4_1Int1<Js::OpLayoutT_Int1Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00383,dumpFunction,reader);
    return;
  case 99:
    data_x00572 = ByteCodeReader::Int32x4_2Int2_Small(reader);
    DumpInt32x4_2Int2<Js::OpLayoutT_Int32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00572,dumpFunction,reader);
    return;
  case 100:
    data_x00522 = ByteCodeReader::Float32x4_IntConst4_Small(reader);
    DumpFloat32x4_IntConst4<Js::OpLayoutT_Float32x4_IntConst4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00522,dumpFunction,reader);
    return;
  case 0x65:
    data_x00162 = ByteCodeReader::Double1Float64x2_1Int1_Small(reader);
    DumpDouble1Float64x2_1Int1<Js::OpLayoutT_Double1Float64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00162,dumpFunction,reader);
    return;
  case 0x66:
    data_26 = ByteCodeReader::Float64x2_2Int1Double1_Small(reader);
    DumpFloat64x2_2Int1Double1<Js::OpLayoutT_Float64x2_2Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_26,dumpFunction,reader);
    return;
  case 0x67:
    data_x00662 = ByteCodeReader::Float64x2_2_Small(reader);
    DumpFloat64x2_2<Js::OpLayoutT_Float64x2_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00662,dumpFunction,reader);
    return;
  case 0x68:
    data_x00658 = ByteCodeReader::Float64x2_3_Small(reader);
    DumpFloat64x2_3<Js::OpLayoutT_Float64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00658,dumpFunction,reader);
    return;
  case 0x69:
    data_47 = ByteCodeReader::Float64x2_1Double1_Small(reader);
    DumpFloat64x2_1Double1<Js::OpLayoutT_Float64x2_1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_47,dumpFunction,reader);
    return;
  case 0x6a:
    data_x00649 = ByteCodeReader::Int64x2_1Long1_Small(reader);
    DumpInt64x2_1Long1<Js::OpLayoutT_Int64x2_1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00649,dumpFunction,reader);
    return;
  case 0x6b:
    data_21 = ByteCodeReader::Long1Int64x2_1Int1_Small(reader);
    DumpLong1Int64x2_1Int1<Js::OpLayoutT_Long1Int64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_21,dumpFunction,reader);
    return;
  case 0x6c:
    data_x00666 = ByteCodeReader::Int64x2_2_Int1_Long1_Small(reader);
    DumpInt64x2_2_Int1_Long1<Js::OpLayoutT_Int64x2_2_Int1_Long1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00666,dumpFunction,reader);
    return;
  case 0x6d:
    data_x00527 = ByteCodeReader::Int64x2_3_Small(reader);
    DumpInt64x2_3<Js::OpLayoutT_Int64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00527,dumpFunction,reader);
    return;
  case 0x6e:
    data_45 = ByteCodeReader::Int64x2_2_Small(reader);
    DumpInt64x2_2<Js::OpLayoutT_Int64x2_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_45,dumpFunction,reader);
    return;
  case 0x6f:
    data_x00604 = ByteCodeReader::Int64x2_2Int1_Small(reader);
    DumpInt64x2_2Int1<Js::OpLayoutT_Int64x2_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00604,dumpFunction,reader);
    return;
  case 0x70:
    data_x00186 = ByteCodeReader::Int1Bool64x2_1_Small(reader);
    DumpInt1Bool64x2_1<Js::OpLayoutT_Int1Bool64x2_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00186,dumpFunction,reader);
    return;
  case 0x71:
    data_x00127 = ByteCodeReader::Int16x8_1Int8_Small(reader);
    DumpInt16x8_1Int8<Js::OpLayoutT_Int16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00127,dumpFunction,reader);
    return;
  case 0x72:
    data_x00537 = ByteCodeReader::Reg1Int16x8_1_Small(reader);
    DumpReg1Int16x8_1<Js::OpLayoutT_Reg1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00537,dumpFunction,reader);
    return;
  case 0x73:
    data_x00251 = ByteCodeReader::Int16x8_2_Small(reader);
    DumpInt16x8_2<Js::OpLayoutT_Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00251,dumpFunction,reader);
    return;
  case 0x74:
    data_x00655 = ByteCodeReader::Int1Int16x8_1Int1_Small(reader);
    DumpInt1Int16x8_1Int1<Js::OpLayoutT_Int1Int16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00655,dumpFunction,reader);
    return;
  case 0x75:
    data_17 = ByteCodeReader::Int16x8_2Int8_Small(reader);
    DumpInt16x8_2Int8<Js::OpLayoutT_Int16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_17,dumpFunction,reader);
    return;
  case 0x76:
    data_35 = ByteCodeReader::Int16x8_3Int8_Small(reader);
    DumpInt16x8_3Int8<Js::OpLayoutT_Int16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_35,dumpFunction,reader);
    return;
  case 0x77:
    data_58 = ByteCodeReader::Int16x8_1Int1_Small(reader);
    DumpInt16x8_1Int1<Js::OpLayoutT_Int16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_58,dumpFunction,reader);
    return;
  case 0x78:
    data_x00174 = ByteCodeReader::Int16x8_2Int2_Small(reader);
    DumpInt16x8_2Int2<Js::OpLayoutT_Int16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00174,dumpFunction,reader);
    return;
  case 0x79:
    data_x00641 = ByteCodeReader::Int16x8_3_Small(reader);
    DumpInt16x8_3<Js::OpLayoutT_Int16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00641,dumpFunction,reader);
    return;
  case 0x7a:
    data_x00567 = ByteCodeReader::Bool16x8_1Int16x8_2_Small(reader);
    DumpBool16x8_1Int16x8_2<Js::OpLayoutT_Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00567,dumpFunction,reader);
    return;
  case 0x7b:
    data_19 = ByteCodeReader::Int16x8_1Bool16x8_1Int16x8_2_Small(reader);
    DumpInt16x8_1Bool16x8_1Int16x8_2<Js::OpLayoutT_Int16x8_1Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_19,dumpFunction,reader);
    return;
  case 0x7c:
    data_24 = ByteCodeReader::Int16x8_2Int1_Small(reader);
    DumpInt16x8_2Int1<Js::OpLayoutT_Int16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_24,dumpFunction,reader);
    return;
  case 0x7d:
    data_x00659 = ByteCodeReader::Int16x8_1Float32x4_1_Small(reader);
    DumpInt16x8_1Float32x4_1<Js::OpLayoutT_Int16x8_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00659,dumpFunction,reader);
    return;
  case 0x7e:
    data_x00533 = ByteCodeReader::Int16x8_1Int32x4_1_Small(reader);
    DumpInt16x8_1Int32x4_1<Js::OpLayoutT_Int16x8_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00533,dumpFunction,reader);
    return;
  case 0x7f:
    data_x00220 = ByteCodeReader::Int16x8_1Int8x16_1_Small(reader);
    DumpInt16x8_1Int8x16_1<Js::OpLayoutT_Int16x8_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00220,dumpFunction,reader);
    return;
  case 0x80:
    data_x00192 = ByteCodeReader::Int16x8_1Uint32x4_1_Small(reader);
    DumpInt16x8_1Uint32x4_1<Js::OpLayoutT_Int16x8_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00192,dumpFunction,reader);
    return;
  case 0x81:
    data_x00596 = ByteCodeReader::Int16x8_1Uint16x8_1_Small(reader);
    DumpInt16x8_1Uint16x8_1<Js::OpLayoutT_Int16x8_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00596,dumpFunction,reader);
    return;
  case 0x82:
    data_x00360 = ByteCodeReader::Int16x8_1Uint8x16_1_Small(reader);
    DumpInt16x8_1Uint8x16_1<Js::OpLayoutT_Int16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00360,dumpFunction,reader);
    return;
  case 0x83:
    data_x00645 = ByteCodeReader::Int8x16_2_Small(reader);
    DumpInt8x16_2<Js::OpLayoutT_Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00645,dumpFunction,reader);
    return;
  case 0x84:
    data_10 = ByteCodeReader::Int8x16_3_Small(reader);
    DumpInt8x16_3<Js::OpLayoutT_Int8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_10,dumpFunction,reader);
    return;
  case 0x85:
    data_11 = ByteCodeReader::Int8x16_1Int16_Small(reader);
    DumpInt8x16_1Int16<Js::OpLayoutT_Int8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_11,dumpFunction,reader);
    return;
  case 0x86:
    data_16 = ByteCodeReader::Int8x16_2Int16_Small(reader);
    DumpInt8x16_2Int16<Js::OpLayoutT_Int8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_16,dumpFunction,reader);
    return;
  case 0x87:
    data_89 = ByteCodeReader::Int8x16_3Int16_Small(reader);
    DumpInt8x16_3Int16<Js::OpLayoutT_Int8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_89,dumpFunction,reader);
    return;
  case 0x88:
    data_x00627 = ByteCodeReader::Int8x16_1Int1_Small(reader);
    DumpInt8x16_1Int1<Js::OpLayoutT_Int8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00627,dumpFunction,reader);
    return;
  case 0x89:
    data_x00616 = ByteCodeReader::Int8x16_2Int1_Small(reader);
    DumpInt8x16_2Int1<Js::OpLayoutT_Int8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00616,dumpFunction,reader);
    return;
  case 0x8a:
    data_x00145 = ByteCodeReader::Reg1Int8x16_1_Small(reader);
    DumpReg1Int8x16_1<Js::OpLayoutT_Reg1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00145,dumpFunction,reader);
    return;
  case 0x8b:
    data_x00561 = ByteCodeReader::Bool8x16_1Int8x16_2_Small(reader);
    DumpBool8x16_1Int8x16_2<Js::OpLayoutT_Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00561,dumpFunction,reader);
    return;
  case 0x8c:
    data_x00660 = ByteCodeReader::Int8x16_1Bool8x16_1Int8x16_2_Small(reader);
    DumpInt8x16_1Bool8x16_1Int8x16_2<Js::OpLayoutT_Int8x16_1Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00660,dumpFunction,reader);
    return;
  case 0x8d:
    data_71 = ByteCodeReader::Int8x16_1Float32x4_1_Small(reader);
    DumpInt8x16_1Float32x4_1<Js::OpLayoutT_Int8x16_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_71,dumpFunction,reader);
    return;
  case 0x8e:
    data_x00574 = ByteCodeReader::Int8x16_1Int32x4_1_Small(reader);
    DumpInt8x16_1Int32x4_1<Js::OpLayoutT_Int8x16_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00574,dumpFunction,reader);
    return;
  case 0x8f:
    data_x00464 = ByteCodeReader::Int8x16_1Int16x8_1_Small(reader);
    DumpInt8x16_1Int16x8_1<Js::OpLayoutT_Int8x16_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00464,dumpFunction,reader);
    return;
  case 0x90:
    data_x00653 = ByteCodeReader::Int8x16_1Uint32x4_1_Small(reader);
    DumpInt8x16_1Uint32x4_1<Js::OpLayoutT_Int8x16_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00653,dumpFunction,reader);
    return;
  case 0x91:
    data_x00656 = ByteCodeReader::Int8x16_1Uint16x8_1_Small(reader);
    DumpInt8x16_1Uint16x8_1<Js::OpLayoutT_Int8x16_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00656,dumpFunction,reader);
    return;
  case 0x92:
    data_x00589 = ByteCodeReader::Int8x16_1Uint8x16_1_Small(reader);
    DumpInt8x16_1Uint8x16_1<Js::OpLayoutT_Int8x16_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00589,dumpFunction,reader);
    return;
  case 0x93:
    data_x00414 = ByteCodeReader::Int1Int8x16_1Int1_Small(reader);
    DumpInt1Int8x16_1Int1<Js::OpLayoutT_Int1Int8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00414,dumpFunction,reader);
    return;
  case 0x94:
    data_x00222 = ByteCodeReader::Int8x16_2Int2_Small(reader);
    DumpInt8x16_2Int2<Js::OpLayoutT_Int8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00222,dumpFunction,reader);
    return;
  case 0x95:
    data_x00520 = ByteCodeReader::Uint32x4_1Int4_Small(reader);
    DumpUint32x4_1Int4<Js::OpLayoutT_Uint32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00520,dumpFunction,reader);
    return;
  case 0x96:
    data_x00102 = ByteCodeReader::Reg1Uint32x4_1_Small(reader);
    DumpReg1Uint32x4_1<Js::OpLayoutT_Reg1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00102,dumpFunction,reader);
    return;
  case 0x97:
    data_x00427 = ByteCodeReader::Uint32x4_2_Small(reader);
    DumpUint32x4_2<Js::OpLayoutT_Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00427,dumpFunction,reader);
    return;
  case 0x98:
    data_x00447 = ByteCodeReader::Int1Uint32x4_1Int1_Small(reader);
    DumpInt1Uint32x4_1Int1<Js::OpLayoutT_Int1Uint32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00447,dumpFunction,reader);
    return;
  case 0x99:
    data_x00336 = ByteCodeReader::Uint32x4_2Int4_Small(reader);
    DumpUint32x4_2Int4<Js::OpLayoutT_Uint32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00336,dumpFunction,reader);
    return;
  case 0x9a:
    data_x00439 = ByteCodeReader::Uint32x4_3Int4_Small(reader);
    DumpUint32x4_3Int4<Js::OpLayoutT_Uint32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00439,dumpFunction,reader);
    return;
  case 0x9b:
    data_x00634 = ByteCodeReader::Uint32x4_1Int1_Small(reader);
    DumpUint32x4_1Int1<Js::OpLayoutT_Uint32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00634,dumpFunction,reader);
    return;
  case 0x9c:
    data_x00477 = ByteCodeReader::Uint32x4_2Int2_Small(reader);
    DumpUint32x4_2Int2<Js::OpLayoutT_Uint32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00477,dumpFunction,reader);
    return;
  case 0x9d:
    data_x00648 = ByteCodeReader::Uint32x4_3_Small(reader);
    DumpUint32x4_3<Js::OpLayoutT_Uint32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00648,dumpFunction,reader);
    return;
  case 0x9e:
    data_12 = ByteCodeReader::Bool32x4_1Uint32x4_2_Small(reader);
    DumpBool32x4_1Uint32x4_2<Js::OpLayoutT_Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_12,dumpFunction,reader);
    return;
  case 0x9f:
    data_18 = ByteCodeReader::Uint32x4_1Bool32x4_1Uint32x4_2_Small(reader);
    DumpUint32x4_1Bool32x4_1Uint32x4_2<Js::OpLayoutT_Uint32x4_1Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_18,dumpFunction,reader);
    return;
  case 0xa0:
    data_61 = ByteCodeReader::Uint32x4_2Int1_Small(reader);
    DumpUint32x4_2Int1<Js::OpLayoutT_Uint32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_61,dumpFunction,reader);
    return;
  case 0xa1:
    data_x00501 = ByteCodeReader::Uint32x4_1Float32x4_1_Small(reader);
    DumpUint32x4_1Float32x4_1<Js::OpLayoutT_Uint32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00501,dumpFunction,reader);
    return;
  case 0xa2:
    data_x00351 = ByteCodeReader::Uint32x4_1Int32x4_1_Small(reader);
    DumpUint32x4_1Int32x4_1<Js::OpLayoutT_Uint32x4_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00351,dumpFunction,reader);
    return;
  case 0xa3:
    data_14 = ByteCodeReader::Uint32x4_1Int16x8_1_Small(reader);
    DumpUint32x4_1Int16x8_1<Js::OpLayoutT_Uint32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_14,dumpFunction,reader);
    return;
  case 0xa4:
    data_x00144 = ByteCodeReader::Uint32x4_1Int8x16_1_Small(reader);
    DumpUint32x4_1Int8x16_1<Js::OpLayoutT_Uint32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00144,dumpFunction,reader);
    return;
  case 0xa5:
    data_x00542 = ByteCodeReader::Uint32x4_1Uint16x8_1_Small(reader);
    DumpUint32x4_1Uint16x8_1<Js::OpLayoutT_Uint32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00542,dumpFunction,reader);
    return;
  case 0xa6:
    data_54 = ByteCodeReader::Uint32x4_1Uint8x16_1_Small(reader);
    DumpUint32x4_1Uint8x16_1<Js::OpLayoutT_Uint32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_54,dumpFunction,reader);
    return;
  case 0xa7:
    data_13 = ByteCodeReader::Uint16x8_1Int8_Small(reader);
    DumpUint16x8_1Int8<Js::OpLayoutT_Uint16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_13,dumpFunction,reader);
    return;
  case 0xa8:
    data_x00177 = ByteCodeReader::Reg1Uint16x8_1_Small(reader);
    DumpReg1Uint16x8_1<Js::OpLayoutT_Reg1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00177,dumpFunction,reader);
    return;
  case 0xa9:
    data_x00316 = ByteCodeReader::Uint16x8_2_Small(reader);
    DumpUint16x8_2<Js::OpLayoutT_Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00316,dumpFunction,reader);
    return;
  case 0xaa:
    data_x00347 = ByteCodeReader::Int1Uint16x8_1Int1_Small(reader);
    DumpInt1Uint16x8_1Int1<Js::OpLayoutT_Int1Uint16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00347,dumpFunction,reader);
    return;
  case 0xab:
    data_x00496 = ByteCodeReader::Uint16x8_2Int8_Small(reader);
    DumpUint16x8_2Int8<Js::OpLayoutT_Uint16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00496,dumpFunction,reader);
    return;
  case 0xac:
    data_x00663 = ByteCodeReader::Uint16x8_3Int8_Small(reader);
    DumpUint16x8_3Int8<Js::OpLayoutT_Uint16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00663,dumpFunction,reader);
    return;
  case 0xad:
    data_x00631 = ByteCodeReader::Uint16x8_1Int1_Small(reader);
    DumpUint16x8_1Int1<Js::OpLayoutT_Uint16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00631,dumpFunction,reader);
    return;
  case 0xae:
    data_x00154 = ByteCodeReader::Uint16x8_2Int2_Small(reader);
    DumpUint16x8_2Int2<Js::OpLayoutT_Uint16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00154,dumpFunction,reader);
    return;
  case 0xaf:
    data_x00598 = ByteCodeReader::Uint16x8_3_Small(reader);
    DumpUint16x8_3<Js::OpLayoutT_Uint16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00598,dumpFunction,reader);
    return;
  case 0xb0:
    data_62 = ByteCodeReader::Bool16x8_1Uint16x8_2_Small(reader);
    DumpBool16x8_1Uint16x8_2<Js::OpLayoutT_Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_62,dumpFunction,reader);
    return;
  case 0xb1:
    data_x00637 = ByteCodeReader::Uint16x8_1Bool16x8_1Uint16x8_2_Small(reader);
    DumpUint16x8_1Bool16x8_1Uint16x8_2<Js::OpLayoutT_Uint16x8_1Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00637,dumpFunction,reader);
    return;
  case 0xb2:
    data_15 = ByteCodeReader::Uint16x8_2Int1_Small(reader);
    DumpUint16x8_2Int1<Js::OpLayoutT_Uint16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_15,dumpFunction,reader);
    return;
  case 0xb3:
    data_x00614 = ByteCodeReader::Uint16x8_1Float32x4_1_Small(reader);
    DumpUint16x8_1Float32x4_1<Js::OpLayoutT_Uint16x8_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00614,dumpFunction,reader);
    return;
  case 0xb4:
    data_x00212 = ByteCodeReader::Uint16x8_1Int32x4_1_Small(reader);
    DumpUint16x8_1Int32x4_1<Js::OpLayoutT_Uint16x8_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00212,dumpFunction,reader);
    return;
  case 0xb5:
    data_38 = ByteCodeReader::Uint16x8_1Int16x8_1_Small(reader);
    DumpUint16x8_1Int16x8_1<Js::OpLayoutT_Uint16x8_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_38,dumpFunction,reader);
    return;
  case 0xb6:
    data_25 = ByteCodeReader::Uint16x8_1Int8x16_1_Small(reader);
    DumpUint16x8_1Int8x16_1<Js::OpLayoutT_Uint16x8_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_25,dumpFunction,reader);
    return;
  case 0xb7:
    data_x00269 = ByteCodeReader::Uint16x8_1Uint32x4_1_Small(reader);
    DumpUint16x8_1Uint32x4_1<Js::OpLayoutT_Uint16x8_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00269,dumpFunction,reader);
    return;
  case 0xb8:
    data_x00434 = ByteCodeReader::Uint16x8_1Uint8x16_1_Small(reader);
    DumpUint16x8_1Uint8x16_1<Js::OpLayoutT_Uint16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00434,dumpFunction,reader);
    return;
  case 0xb9:
    data_x00345 = ByteCodeReader::Uint8x16_1Int16_Small(reader);
    DumpUint8x16_1Int16<Js::OpLayoutT_Uint8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00345,dumpFunction,reader);
    return;
  case 0xba:
    data_x00446 = ByteCodeReader::Reg1Uint8x16_1_Small(reader);
    DumpReg1Uint8x16_1<Js::OpLayoutT_Reg1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00446,dumpFunction,reader);
    return;
  case 0xbb:
    data_x00640 = ByteCodeReader::Uint8x16_2_Small(reader);
    DumpUint8x16_2<Js::OpLayoutT_Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00640,dumpFunction,reader);
    return;
  case 0xbc:
    data_x00609 = ByteCodeReader::Int1Uint8x16_1Int1_Small(reader);
    DumpInt1Uint8x16_1Int1<Js::OpLayoutT_Int1Uint8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00609,dumpFunction,reader);
    return;
  case 0xbd:
    data_x00168 = ByteCodeReader::Uint8x16_2Int16_Small(reader);
    DumpUint8x16_2Int16<Js::OpLayoutT_Uint8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00168,dumpFunction,reader);
    return;
  case 0xbe:
    data_x00652 = ByteCodeReader::Uint8x16_3Int16_Small(reader);
    DumpUint8x16_3Int16<Js::OpLayoutT_Uint8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00652,dumpFunction,reader);
    return;
  case 0xbf:
    data_x00543 = ByteCodeReader::Uint8x16_1Int1_Small(reader);
    DumpUint8x16_1Int1<Js::OpLayoutT_Uint8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00543,dumpFunction,reader);
    return;
  case 0xc0:
    data_x00619 = ByteCodeReader::Uint8x16_2Int2_Small(reader);
    DumpUint8x16_2Int2<Js::OpLayoutT_Uint8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00619,dumpFunction,reader);
    return;
  case 0xc1:
    data_x00453 = ByteCodeReader::Uint8x16_3_Small(reader);
    DumpUint8x16_3<Js::OpLayoutT_Uint8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00453,dumpFunction,reader);
    return;
  case 0xc2:
    data_56 = ByteCodeReader::Bool8x16_1Uint8x16_2_Small(reader);
    DumpBool8x16_1Uint8x16_2<Js::OpLayoutT_Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_56,dumpFunction,reader);
    return;
  case 0xc3:
    data_x00623 = ByteCodeReader::Uint8x16_1Bool8x16_1Uint8x16_2_Small(reader);
    DumpUint8x16_1Bool8x16_1Uint8x16_2<Js::OpLayoutT_Uint8x16_1Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00623,dumpFunction,reader);
    return;
  case 0xc4:
    data_x00610 = ByteCodeReader::Uint8x16_2Int1_Small(reader);
    DumpUint8x16_2Int1<Js::OpLayoutT_Uint8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00610,dumpFunction,reader);
    return;
  case 0xc5:
    data_x00113 = ByteCodeReader::Uint8x16_1Float32x4_1_Small(reader);
    DumpUint8x16_1Float32x4_1<Js::OpLayoutT_Uint8x16_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00113,dumpFunction,reader);
    return;
  case 0xc6:
    data_x00435 = ByteCodeReader::Uint8x16_1Int32x4_1_Small(reader);
    DumpUint8x16_1Int32x4_1<Js::OpLayoutT_Uint8x16_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00435,dumpFunction,reader);
    return;
  case 199:
    data_x00612 = ByteCodeReader::Uint8x16_1Int16x8_1_Small(reader);
    DumpUint8x16_1Int16x8_1<Js::OpLayoutT_Uint8x16_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00612,dumpFunction,reader);
    return;
  case 200:
    data_x00122 = ByteCodeReader::Uint8x16_1Int8x16_1_Small(reader);
    DumpUint8x16_1Int8x16_1<Js::OpLayoutT_Uint8x16_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00122,dumpFunction,reader);
    return;
  case 0xc9:
    data_x00111 = ByteCodeReader::Uint8x16_1Uint32x4_1_Small(reader);
    DumpUint8x16_1Uint32x4_1<Js::OpLayoutT_Uint8x16_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00111,dumpFunction,reader);
    return;
  case 0xca:
    data_x00651 = ByteCodeReader::Uint8x16_1Uint16x8_1_Small(reader);
    DumpUint8x16_1Uint16x8_1<Js::OpLayoutT_Uint8x16_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00651,dumpFunction,reader);
    return;
  case 0xcb:
    data_x00489 = ByteCodeReader::Bool32x4_1Int1_Small(reader);
    DumpBool32x4_1Int1<Js::OpLayoutT_Bool32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00489,dumpFunction,reader);
    return;
  case 0xcc:
    data_x00243 = ByteCodeReader::Bool32x4_1Int4_Small(reader);
    DumpBool32x4_1Int4<Js::OpLayoutT_Bool32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00243,dumpFunction,reader);
    return;
  case 0xcd:
    data_x00566 = ByteCodeReader::Int1Bool32x4_1Int1_Small(reader);
    DumpInt1Bool32x4_1Int1<Js::OpLayoutT_Int1Bool32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00566,dumpFunction,reader);
    return;
  case 0xce:
    data_x00563 = ByteCodeReader::Bool32x4_2Int2_Small(reader);
    DumpBool32x4_2Int2<Js::OpLayoutT_Bool32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00563,dumpFunction,reader);
    return;
  case 0xcf:
    data_x00535 = ByteCodeReader::Int1Bool32x4_1_Small(reader);
    DumpInt1Bool32x4_1<Js::OpLayoutT_Int1Bool32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00535,dumpFunction,reader);
    return;
  case 0xd0:
    data_x00620 = ByteCodeReader::Bool32x4_2_Small(reader);
    DumpBool32x4_2<Js::OpLayoutT_Bool32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00620,dumpFunction,reader);
    return;
  case 0xd1:
    data_x00221 = ByteCodeReader::Bool32x4_3_Small(reader);
    DumpBool32x4_3<Js::OpLayoutT_Bool32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00221,dumpFunction,reader);
    return;
  case 0xd2:
    data_x00568 = ByteCodeReader::Reg1Bool32x4_1_Small(reader);
    DumpReg1Bool32x4_1<Js::OpLayoutT_Reg1Bool32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00568,dumpFunction,reader);
    return;
  case 0xd3:
    data_28 = ByteCodeReader::Bool16x8_1Int1_Small(reader);
    DumpBool16x8_1Int1<Js::OpLayoutT_Bool16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_28,dumpFunction,reader);
    return;
  case 0xd4:
    data_x00460 = ByteCodeReader::Bool16x8_1Int8_Small(reader);
    DumpBool16x8_1Int8<Js::OpLayoutT_Bool16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00460,dumpFunction,reader);
    return;
  case 0xd5:
    data_x00490 = ByteCodeReader::Int1Bool16x8_1Int1_Small(reader);
    DumpInt1Bool16x8_1Int1<Js::OpLayoutT_Int1Bool16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00490,dumpFunction,reader);
    return;
  case 0xd6:
    data_x00190 = ByteCodeReader::Bool16x8_2Int2_Small(reader);
    DumpBool16x8_2Int2<Js::OpLayoutT_Bool16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00190,dumpFunction,reader);
    return;
  case 0xd7:
    data_94 = ByteCodeReader::Int1Bool16x8_1_Small(reader);
    DumpInt1Bool16x8_1<Js::OpLayoutT_Int1Bool16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_94,dumpFunction,reader);
    return;
  case 0xd8:
    data_x00163 = ByteCodeReader::Bool16x8_2_Small(reader);
    DumpBool16x8_2<Js::OpLayoutT_Bool16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00163,dumpFunction,reader);
    return;
  case 0xd9:
    data_43 = ByteCodeReader::Bool16x8_3_Small(reader);
    DumpBool16x8_3<Js::OpLayoutT_Bool16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_43,dumpFunction,reader);
    return;
  case 0xda:
    data_x00532 = ByteCodeReader::Reg1Bool16x8_1_Small(reader);
    DumpReg1Bool16x8_1<Js::OpLayoutT_Reg1Bool16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00532,dumpFunction,reader);
    return;
  case 0xdb:
    data_x00172 = ByteCodeReader::Bool8x16_1Int1_Small(reader);
    DumpBool8x16_1Int1<Js::OpLayoutT_Bool8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00172,dumpFunction,reader);
    return;
  case 0xdc:
    data_x00348 = ByteCodeReader::Bool8x16_1Int16_Small(reader);
    DumpBool8x16_1Int16<Js::OpLayoutT_Bool8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00348,dumpFunction,reader);
    return;
  case 0xdd:
    data_x00137 = ByteCodeReader::Int1Bool8x16_1_Small(reader);
    DumpInt1Bool8x16_1<Js::OpLayoutT_Int1Bool8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00137,dumpFunction,reader);
    return;
  case 0xde:
    data_52 = ByteCodeReader::Int1Bool8x16_1Int1_Small(reader);
    DumpInt1Bool8x16_1Int1<Js::OpLayoutT_Int1Bool8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_52,dumpFunction,reader);
    return;
  case 0xdf:
    data_73 = ByteCodeReader::Bool8x16_2Int2_Small(reader);
    DumpBool8x16_2Int2<Js::OpLayoutT_Bool8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_73,dumpFunction,reader);
    return;
  case 0xe0:
    data_x00613 = ByteCodeReader::Bool8x16_2_Small(reader);
    DumpBool8x16_2<Js::OpLayoutT_Bool8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00613,dumpFunction,reader);
    return;
  case 0xe1:
    data_x00130 = ByteCodeReader::Bool8x16_3_Small(reader);
    DumpBool8x16_3<Js::OpLayoutT_Bool8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00130,dumpFunction,reader);
    return;
  case 0xe2:
    data_x00639 = ByteCodeReader::Reg1Bool8x16_1_Small(reader);
    DumpReg1Bool8x16_1<Js::OpLayoutT_Reg1Bool8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00639,dumpFunction,reader);
    return;
  case 0xe3:
    data_22 = ByteCodeReader::AsmSimdTypedArr_Small(reader);
    DumpAsmSimdTypedArr<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_22,dumpFunction,reader);
    return;
  case 0xe4:
    data_x00617 = ByteCodeReader::AsmShuffle_Small(reader);
    DumpAsmShuffle<Js::OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00617,dumpFunction,reader);
    return;
  case 0xe5:
    data_x00552 = ByteCodeReader::ElementSlot_Medium(reader);
    DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00552,dumpFunction,reader);
    return;
  default:
    goto switchD_0072dd5e_caseD_e6;
  case 0xe8:
    data_31 = ByteCodeReader::AsmTypedArr_Medium(reader);
    DumpAsmTypedArr<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_31,dumpFunction,reader);
    return;
  case 0xe9:
    data_x00173 = ByteCodeReader::WasmMemAccess_Medium(reader);
    DumpWasmMemAccess<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00173,dumpFunction,reader);
    return;
  case 0xea:
    data_x00625 = ByteCodeReader::AsmCall_Medium(reader);
    DumpAsmCall<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00625,dumpFunction,reader);
    return;
  case 0xeb:
    data_x00584 = ByteCodeReader::ProfiledAsmCall_Medium(reader);
    DumpProfiledAsmCall<Js::OpLayoutDynamicProfile<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
              (op,data_x00584,dumpFunction,reader);
    return;
  case 0xed:
    pOVar11 = ByteCodeReader::AsmReg1_Medium(reader);
    ByteCodeDumper::DumpReg(pOVar11->R0);
    return;
  case 0xee:
    data_x00107 = ByteCodeReader::AsmReg2_Medium(reader);
    DumpAsmReg2<Js::OpLayoutT_AsmReg2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00107,dumpFunction,reader);
    return;
  case 0xef:
    data_x00241 = ByteCodeReader::AsmReg3_Medium(reader);
    DumpAsmReg3<Js::OpLayoutT_AsmReg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00241,dumpFunction,reader);
    return;
  case 0xf0:
    data_x00170 = ByteCodeReader::AsmReg4_Medium(reader);
    DumpAsmReg4<Js::OpLayoutT_AsmReg4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00170,dumpFunction,reader);
    return;
  case 0xf1:
    data_x00178 = ByteCodeReader::AsmReg5_Medium(reader);
    DumpAsmReg5<Js::OpLayoutT_AsmReg5<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00178,dumpFunction,reader);
    return;
  case 0xf2:
    data_x00585 = ByteCodeReader::AsmReg6_Medium(reader);
    DumpAsmReg6<Js::OpLayoutT_AsmReg6<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00585,dumpFunction,reader);
    return;
  case 0xf3:
    data_x00636 = ByteCodeReader::AsmReg7_Medium(reader);
    DumpAsmReg7<Js::OpLayoutT_AsmReg7<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00636,dumpFunction,reader);
    return;
  case 0xf4:
    data_63 = ByteCodeReader::AsmReg9_Medium(reader);
    DumpAsmReg9<Js::OpLayoutT_AsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_63,dumpFunction,reader);
    return;
  case 0xf5:
    data_x00591 = ByteCodeReader::AsmReg10_Medium(reader);
    DumpAsmReg10<Js::OpLayoutT_AsmReg10<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00591,dumpFunction,reader);
    return;
  case 0xf6:
    data_77 = ByteCodeReader::AsmReg11_Medium(reader);
    DumpAsmReg11<Js::OpLayoutT_AsmReg11<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_77,dumpFunction,reader);
    return;
  case 0xf7:
    data_x00549 = ByteCodeReader::AsmReg17_Medium(reader);
    DumpAsmReg17<Js::OpLayoutT_AsmReg17<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00549,dumpFunction,reader);
    return;
  case 0xf8:
    data_x00540 = ByteCodeReader::AsmReg18_Medium(reader);
    DumpAsmReg18<Js::OpLayoutT_AsmReg18<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00540,dumpFunction,reader);
    return;
  case 0xf9:
    data_x00373 = ByteCodeReader::AsmReg19_Medium(reader);
    DumpAsmReg19<Js::OpLayoutT_AsmReg19<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00373,dumpFunction,reader);
    return;
  case 0xfa:
    data_x00319 = ByteCodeReader::Int1Double1_Medium(reader);
    DumpInt1Double1<Js::OpLayoutT_Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00319,dumpFunction,reader);
    return;
  case 0xfb:
    data_33 = ByteCodeReader::Int1Float1_Medium(reader);
    DumpInt1Float1<Js::OpLayoutT_Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_33,dumpFunction,reader);
    return;
  case 0xfc:
    data_x00253 = ByteCodeReader::Double1Const1_Medium(reader);
    DumpDouble1Const1<Js::OpLayoutT_Double1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00253,dumpFunction,reader);
    return;
  case 0xfd:
    data_70 = ByteCodeReader::Double1Int1_Medium(reader);
    DumpDouble1Int1<Js::OpLayoutT_Double1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_70,dumpFunction,reader);
    return;
  case 0xfe:
    data_x00379 = ByteCodeReader::Double1Float1_Medium(reader);
    DumpDouble1Float1<Js::OpLayoutT_Double1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00379,dumpFunction,reader);
    return;
  case 0xff:
    data_x00628 = ByteCodeReader::Double1Reg1_Medium(reader);
    DumpDouble1Reg1<Js::OpLayoutT_Double1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00628,dumpFunction,reader);
    return;
  case 0x100:
    data_x00507 = ByteCodeReader::Float1Reg1_Medium(reader);
    DumpFloat1Reg1<Js::OpLayoutT_Float1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00507,dumpFunction,reader);
    return;
  case 0x101:
    data_85 = ByteCodeReader::Int1Reg1_Medium(reader);
    DumpInt1Reg1<Js::OpLayoutT_Int1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_85,dumpFunction,reader);
    return;
  case 0x102:
    data_x00632 = ByteCodeReader::Reg1Double1_Medium(reader);
    DumpReg1Double1<Js::OpLayoutT_Reg1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00632,dumpFunction,reader);
    return;
  case 0x103:
    data_80 = ByteCodeReader::Reg1Float1_Medium(reader);
    DumpReg1Float1<Js::OpLayoutT_Reg1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_80,dumpFunction,reader);
    return;
  case 0x104:
    data_x00211 = ByteCodeReader::Reg1Int1_Medium(reader);
    DumpReg1Int1<Js::OpLayoutT_Reg1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00211,dumpFunction,reader);
    return;
  case 0x105:
    data_x00642 = ByteCodeReader::Int1Const1_Medium(reader);
    DumpInt1Const1<Js::OpLayoutT_Int1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00642,dumpFunction,reader);
    return;
  case 0x106:
    data_x00133 = ByteCodeReader::Reg1IntConst1_Medium(reader);
    DumpReg1IntConst1<Js::OpLayoutT_Reg1IntConst1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00133,dumpFunction,reader);
    return;
  case 0x107:
    data_x00564 = ByteCodeReader::Int1Double2_Medium(reader);
    DumpInt1Double2<Js::OpLayoutT_Int1Double2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00564,dumpFunction,reader);
    return;
  case 0x108:
    data_x00580 = ByteCodeReader::Int1Float2_Medium(reader);
    DumpInt1Float2<Js::OpLayoutT_Int1Float2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00580,dumpFunction,reader);
    return;
  case 0x109:
    data_x00576 = ByteCodeReader::Int2_Medium(reader);
    DumpInt2<Js::OpLayoutT_Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00576,dumpFunction,reader);
    return;
  case 0x10a:
    data_76 = ByteCodeReader::Int3_Medium(reader);
    DumpInt3<Js::OpLayoutT_Int3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_76,dumpFunction,reader);
    return;
  case 0x10b:
    data_x00181 = ByteCodeReader::Double2_Medium(reader);
    DumpDouble2<Js::OpLayoutT_Double2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00181,dumpFunction,reader);
    return;
  case 0x10c:
    data_x00579 = ByteCodeReader::Float2_Medium(reader);
    DumpFloat2<Js::OpLayoutT_Float2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00579,dumpFunction,reader);
    return;
  case 0x10d:
    data_x00624 = ByteCodeReader::Float3_Medium(reader);
    DumpFloat3<Js::OpLayoutT_Float3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00624,dumpFunction,reader);
    return;
  case 0x10e:
    data_48 = ByteCodeReader::Float1Const1_Medium(reader);
    DumpFloat1Const1<Js::OpLayoutT_Float1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_48,dumpFunction,reader);
    return;
  case 0x10f:
    data_x00559 = ByteCodeReader::Float1Double1_Medium(reader);
    DumpFloat1Double1<Js::OpLayoutT_Float1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00559,dumpFunction,reader);
    return;
  case 0x110:
    data_x00245 = ByteCodeReader::Float1Int1_Medium(reader);
    DumpFloat1Int1<Js::OpLayoutT_Float1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00245,dumpFunction,reader);
    return;
  case 0x111:
    data_x00413 = ByteCodeReader::Double3_Medium(reader);
    DumpDouble3<Js::OpLayoutT_Double3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00413,dumpFunction,reader);
    return;
  case 0x112:
    data_x00299 = ByteCodeReader::BrInt1_Medium(reader);
    DumpBrInt1<Js::OpLayoutT_BrInt1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00299,dumpFunction,reader);
    return;
  case 0x113:
    data_x00558 = ByteCodeReader::BrInt2_Medium(reader);
    DumpBrInt2<Js::OpLayoutT_BrInt2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00558,dumpFunction,reader);
    return;
  case 0x114:
    data_x00577 = ByteCodeReader::BrInt1Const1_Medium(reader);
    DumpBrInt1Const1<Js::OpLayoutT_BrInt1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00577,dumpFunction,reader);
    return;
  case 0x115:
    pOVar6 = (OpLayoutWasmLoopStart_Medium *)ByteCodeReader::AsmUnsigned1_Medium(reader);
    goto LAB_0072e582;
  case 0x116:
    pOVar6 = ByteCodeReader::WasmLoopStart_Medium(reader);
LAB_0072e582:
    value = (UnsignedType)pOVar6->loopId;
    goto LAB_00731d7e;
  case 0x117:
    data_x00117 = ByteCodeReader::Long1Reg1_Medium(reader);
    DumpLong1Reg1<Js::OpLayoutT_Long1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00117,dumpFunction,reader);
    return;
  case 0x118:
    data_53 = ByteCodeReader::Reg1Long1_Medium(reader);
    DumpReg1Long1<Js::OpLayoutT_Reg1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_53,dumpFunction,reader);
    return;
  case 0x119:
    data_42 = ByteCodeReader::Long1Const1_Medium(reader);
    DumpLong1Const1<Js::OpLayoutT_Long1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_42,dumpFunction,reader);
    return;
  case 0x11a:
    data_x00483 = ByteCodeReader::Long2_Medium(reader);
    DumpLong2<Js::OpLayoutT_Long2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00483,dumpFunction,reader);
    return;
  case 0x11b:
    data_x00143 = ByteCodeReader::Long3_Medium(reader);
    DumpLong3<Js::OpLayoutT_Long3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00143,dumpFunction,reader);
    return;
  case 0x11c:
    data_x00480 = ByteCodeReader::Int1Long2_Medium(reader);
    DumpInt1Long2<Js::OpLayoutT_Int1Long2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00480,dumpFunction,reader);
    return;
  case 0x11d:
    data_39 = ByteCodeReader::Long1Int1_Medium(reader);
    DumpLong1Int1<Js::OpLayoutT_Long1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_39,dumpFunction,reader);
    return;
  case 0x11e:
    data_50 = ByteCodeReader::Int1Long1_Medium(reader);
    DumpInt1Long1<Js::OpLayoutT_Int1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_50,dumpFunction,reader);
    return;
  case 0x11f:
    data_98 = ByteCodeReader::Long1Float1_Medium(reader);
    DumpLong1Float1<Js::OpLayoutT_Long1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_98,dumpFunction,reader);
    return;
  case 0x120:
    data_36 = ByteCodeReader::Float1Long1_Medium(reader);
    DumpFloat1Long1<Js::OpLayoutT_Float1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_36,dumpFunction,reader);
    return;
  case 0x121:
    data_x00633 = ByteCodeReader::Long1Double1_Medium(reader);
    DumpLong1Double1<Js::OpLayoutT_Long1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00633,dumpFunction,reader);
    return;
  case 0x122:
    data_x00474 = ByteCodeReader::Double1Long1_Medium(reader);
    DumpDouble1Long1<Js::OpLayoutT_Double1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00474,dumpFunction,reader);
    return;
  case 0x123:
    data_x00289 = ByteCodeReader::Float32x4_2_Medium(reader);
    DumpFloat32x4_2<Js::OpLayoutT_Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00289,dumpFunction,reader);
    return;
  case 0x124:
    data_65 = ByteCodeReader::Float32x4_3_Medium(reader);
    DumpFloat32x4_3<Js::OpLayoutT_Float32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_65,dumpFunction,reader);
    return;
  case 0x125:
    data_49 = ByteCodeReader::Float32x4_4_Medium(reader);
    DumpFloat32x4_4<Js::OpLayoutT_Float32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_49,dumpFunction,reader);
    return;
  case 0x126:
    data_x00592 = ByteCodeReader::Bool32x4_1Float32x4_2_Medium(reader);
    DumpBool32x4_1Float32x4_2<Js::OpLayoutT_Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00592,dumpFunction,reader);
    return;
  case 0x127:
    data_40 = ByteCodeReader::Float32x4_1Bool32x4_1Float32x4_2_Medium(reader);
    DumpFloat32x4_1Bool32x4_1Float32x4_2<Js::OpLayoutT_Float32x4_1Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_40,dumpFunction,reader);
    return;
  case 0x128:
    data_83 = ByteCodeReader::Float32x4_1Float4_Medium(reader);
    DumpFloat32x4_1Float4<Js::OpLayoutT_Float32x4_1Float4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_83,dumpFunction,reader);
    return;
  case 0x129:
    data_x00606 = ByteCodeReader::Float32x4_2Int4_Medium(reader);
    DumpFloat32x4_2Int4<Js::OpLayoutT_Float32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00606,dumpFunction,reader);
    return;
  case 0x12a:
    data_x00495 = ByteCodeReader::Float32x4_3Int4_Medium(reader);
    DumpFloat32x4_3Int4<Js::OpLayoutT_Float32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00495,dumpFunction,reader);
    return;
  case 299:
    data_67 = ByteCodeReader::Float32x4_1Float1_Medium(reader);
    DumpFloat32x4_1Float1<Js::OpLayoutT_Float32x4_1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_67,dumpFunction,reader);
    return;
  case 300:
    data_x00595 = ByteCodeReader::Float32x4_2Float1_Medium(reader);
    DumpFloat32x4_2Float1<Js::OpLayoutT_Float32x4_2Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00595,dumpFunction,reader);
    return;
  case 0x12d:
    data_x00216 = ByteCodeReader::Float32x4_1Int32x4_1_Medium(reader);
    DumpFloat32x4_1Int32x4_1<Js::OpLayoutT_Float32x4_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00216,dumpFunction,reader);
    return;
  case 0x12e:
    data_x00248 = ByteCodeReader::Float32x4_1Uint32x4_1_Medium(reader);
    DumpFloat32x4_1Uint32x4_1<Js::OpLayoutT_Float32x4_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00248,dumpFunction,reader);
    return;
  case 0x12f:
    data_x00388 = ByteCodeReader::Float32x4_1Int16x8_1_Medium(reader);
    DumpFloat32x4_1Int16x8_1<Js::OpLayoutT_Float32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00388,dumpFunction,reader);
    return;
  case 0x130:
    data_x00125 = ByteCodeReader::Float32x4_1Uint16x8_1_Medium(reader);
    DumpFloat32x4_1Uint16x8_1<Js::OpLayoutT_Float32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00125,dumpFunction,reader);
    return;
  case 0x131:
    data_x00128 = ByteCodeReader::Float32x4_1Int8x16_1_Medium(reader);
    DumpFloat32x4_1Int8x16_1<Js::OpLayoutT_Float32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00128,dumpFunction,reader);
    return;
  case 0x132:
    data_90 = ByteCodeReader::Float32x4_1Uint8x16_1_Medium(reader);
    DumpFloat32x4_1Uint8x16_1<Js::OpLayoutT_Float32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_90,dumpFunction,reader);
    return;
  case 0x133:
    data_x00466 = ByteCodeReader::Reg1Float32x4_1_Medium(reader);
    DumpReg1Float32x4_1<Js::OpLayoutT_Reg1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00466,dumpFunction,reader);
    return;
  case 0x134:
    data_95 = ByteCodeReader::Float1Float32x4_1Int1_Medium(reader);
    DumpFloat1Float32x4_1Int1<Js::OpLayoutT_Float1Float32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_95,dumpFunction,reader);
    return;
  case 0x135:
    data_x00437 = ByteCodeReader::Float32x4_2Int1Float1_Medium(reader);
    DumpFloat32x4_2Int1Float1<Js::OpLayoutT_Float32x4_2Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00437,dumpFunction,reader);
    return;
  case 0x136:
    data_x00198 = ByteCodeReader::Int32x4_2_Medium(reader);
    DumpInt32x4_2<Js::OpLayoutT_Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00198,dumpFunction,reader);
    return;
  case 0x137:
    data_x00150 = ByteCodeReader::Int32x4_3_Medium(reader);
    DumpInt32x4_3<Js::OpLayoutT_Int32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00150,dumpFunction,reader);
    return;
  case 0x138:
    data_46 = ByteCodeReader::Int32x4_4_Medium(reader);
    DumpInt32x4_4<Js::OpLayoutT_Int32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_46,dumpFunction,reader);
    return;
  case 0x139:
    data_74 = ByteCodeReader::Bool32x4_1Int32x4_2_Medium(reader);
    DumpBool32x4_1Int32x4_2<Js::OpLayoutT_Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_74,dumpFunction,reader);
    return;
  case 0x13a:
    data_x00187 = ByteCodeReader::Int32x4_1Bool32x4_1Int32x4_2_Medium(reader);
    DumpInt32x4_1Bool32x4_1Int32x4_2<Js::OpLayoutT_Int32x4_1Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00187,dumpFunction,reader);
    return;
  case 0x13b:
    data_x00201 = ByteCodeReader::Int32x4_1Int4_Medium(reader);
    DumpInt32x4_1Int4<Js::OpLayoutT_Int32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00201,dumpFunction,reader);
    return;
  case 0x13c:
    data_x00611 = ByteCodeReader::Int32x4_2Int4_Medium(reader);
    DumpInt32x4_2Int4<Js::OpLayoutT_Int32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00611,dumpFunction,reader);
    return;
  case 0x13d:
    data_x00452 = ByteCodeReader::Int32x4_3Int4_Medium(reader);
    DumpInt32x4_3Int4<Js::OpLayoutT_Int32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00452,dumpFunction,reader);
    return;
  case 0x13e:
    data_93 = ByteCodeReader::Int32x4_1Int1_Medium(reader);
    DumpInt32x4_1Int1<Js::OpLayoutT_Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_93,dumpFunction,reader);
    return;
  case 0x13f:
    data_x00166 = ByteCodeReader::Int32x4_2Int1_Medium(reader);
    DumpInt32x4_2Int1<Js::OpLayoutT_Int32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00166,dumpFunction,reader);
    return;
  case 0x140:
    data_x00602 = ByteCodeReader::Reg1Int32x4_1_Medium(reader);
    DumpReg1Int32x4_1<Js::OpLayoutT_Reg1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00602,dumpFunction,reader);
    return;
  case 0x141:
    data_x00230 = ByteCodeReader::Int32x4_1Float32x4_1_Medium(reader);
    DumpInt32x4_1Float32x4_1<Js::OpLayoutT_Int32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00230,dumpFunction,reader);
    return;
  case 0x142:
    data_x00555 = ByteCodeReader::Int32x4_1Uint32x4_1_Medium(reader);
    DumpInt32x4_1Uint32x4_1<Js::OpLayoutT_Int32x4_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00555,dumpFunction,reader);
    return;
  case 0x143:
    data_x00499 = ByteCodeReader::Int32x4_1Int16x8_1_Medium(reader);
    DumpInt32x4_1Int16x8_1<Js::OpLayoutT_Int32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00499,dumpFunction,reader);
    return;
  case 0x144:
    data_x00600 = ByteCodeReader::Int32x4_1Uint16x8_1_Medium(reader);
    DumpInt32x4_1Uint16x8_1<Js::OpLayoutT_Int32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00600,dumpFunction,reader);
    return;
  case 0x145:
    data_72 = ByteCodeReader::Int32x4_1Int8x16_1_Medium(reader);
    DumpInt32x4_1Int8x16_1<Js::OpLayoutT_Int32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_72,dumpFunction,reader);
    return;
  case 0x146:
    data_x00103 = ByteCodeReader::Int32x4_1Uint8x16_1_Medium(reader);
    DumpInt32x4_1Uint8x16_1<Js::OpLayoutT_Int32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00103,dumpFunction,reader);
    return;
  case 0x147:
    data_x00601 = ByteCodeReader::Int1Int32x4_1Int1_Medium(reader);
    DumpInt1Int32x4_1Int1<Js::OpLayoutT_Int1Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00601,dumpFunction,reader);
    return;
  case 0x148:
    data_x00621 = ByteCodeReader::Int32x4_2Int2_Medium(reader);
    DumpInt32x4_2Int2<Js::OpLayoutT_Int32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00621,dumpFunction,reader);
    return;
  case 0x149:
    data_x00116 = ByteCodeReader::Float32x4_IntConst4_Medium(reader);
    DumpFloat32x4_IntConst4<Js::OpLayoutT_Float32x4_IntConst4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00116,dumpFunction,reader);
    return;
  case 0x14a:
    data_x00309 = ByteCodeReader::Double1Float64x2_1Int1_Medium(reader);
    DumpDouble1Float64x2_1Int1<Js::OpLayoutT_Double1Float64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00309,dumpFunction,reader);
    return;
  case 0x14b:
    data_x00450 = ByteCodeReader::Float64x2_2Int1Double1_Medium(reader);
    DumpFloat64x2_2Int1Double1<Js::OpLayoutT_Float64x2_2Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00450,dumpFunction,reader);
    return;
  case 0x14c:
    data_x00159 = ByteCodeReader::Float64x2_2_Medium(reader);
    DumpFloat64x2_2<Js::OpLayoutT_Float64x2_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00159,dumpFunction,reader);
    return;
  case 0x14d:
    data_x00411 = ByteCodeReader::Float64x2_3_Medium(reader);
    DumpFloat64x2_3<Js::OpLayoutT_Float64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00411,dumpFunction,reader);
    return;
  case 0x14e:
    data_68 = ByteCodeReader::Float64x2_1Double1_Medium(reader);
    DumpFloat64x2_1Double1<Js::OpLayoutT_Float64x2_1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_68,dumpFunction,reader);
    return;
  case 0x14f:
    data_x00553 = ByteCodeReader::Int64x2_1Long1_Medium(reader);
    DumpInt64x2_1Long1<Js::OpLayoutT_Int64x2_1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00553,dumpFunction,reader);
    return;
  case 0x150:
    data_x00400 = ByteCodeReader::Long1Int64x2_1Int1_Medium(reader);
    DumpLong1Int64x2_1Int1<Js::OpLayoutT_Long1Int64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00400,dumpFunction,reader);
    return;
  case 0x151:
    data_x00110 = ByteCodeReader::Int64x2_2_Int1_Long1_Medium(reader);
    DumpInt64x2_2_Int1_Long1<Js::OpLayoutT_Int64x2_2_Int1_Long1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00110,dumpFunction,reader);
    return;
  case 0x152:
    data_x00491 = ByteCodeReader::Int64x2_3_Medium(reader);
    DumpInt64x2_3<Js::OpLayoutT_Int64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00491,dumpFunction,reader);
    return;
  case 0x153:
    data_x00554 = ByteCodeReader::Int64x2_2_Medium(reader);
    DumpInt64x2_2<Js::OpLayoutT_Int64x2_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00554,dumpFunction,reader);
    return;
  case 0x154:
    data_x00399 = ByteCodeReader::Int64x2_2Int1_Medium(reader);
    DumpInt64x2_2Int1<Js::OpLayoutT_Int64x2_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00399,dumpFunction,reader);
    return;
  case 0x155:
    data_x00546 = ByteCodeReader::Int1Bool64x2_1_Medium(reader);
    DumpInt1Bool64x2_1<Js::OpLayoutT_Int1Bool64x2_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00546,dumpFunction,reader);
    return;
  case 0x156:
    data_x00270 = ByteCodeReader::Int16x8_1Int8_Medium(reader);
    DumpInt16x8_1Int8<Js::OpLayoutT_Int16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00270,dumpFunction,reader);
    return;
  case 0x157:
    data_x00356 = ByteCodeReader::Reg1Int16x8_1_Medium(reader);
    DumpReg1Int16x8_1<Js::OpLayoutT_Reg1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00356,dumpFunction,reader);
    return;
  case 0x158:
    data_x00599 = ByteCodeReader::Int16x8_2_Medium(reader);
    DumpInt16x8_2<Js::OpLayoutT_Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00599,dumpFunction,reader);
    return;
  case 0x159:
    data_x00398 = ByteCodeReader::Int1Int16x8_1Int1_Medium(reader);
    DumpInt1Int16x8_1Int1<Js::OpLayoutT_Int1Int16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00398,dumpFunction,reader);
    return;
  case 0x15a:
    data_x00234 = ByteCodeReader::Int16x8_2Int8_Medium(reader);
    DumpInt16x8_2Int8<Js::OpLayoutT_Int16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00234,dumpFunction,reader);
    return;
  case 0x15b:
    data_x00415 = ByteCodeReader::Int16x8_3Int8_Medium(reader);
    DumpInt16x8_3Int8<Js::OpLayoutT_Int16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00415,dumpFunction,reader);
    return;
  case 0x15c:
    data_x00597 = ByteCodeReader::Int16x8_1Int1_Medium(reader);
    DumpInt16x8_1Int1<Js::OpLayoutT_Int16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00597,dumpFunction,reader);
    return;
  case 0x15d:
    data_x00261 = ByteCodeReader::Int16x8_2Int2_Medium(reader);
    DumpInt16x8_2Int2<Js::OpLayoutT_Int16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00261,dumpFunction,reader);
    return;
  case 0x15e:
    data_x00141 = ByteCodeReader::Int16x8_3_Medium(reader);
    DumpInt16x8_3<Js::OpLayoutT_Int16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00141,dumpFunction,reader);
    return;
  case 0x15f:
    data_x00185 = ByteCodeReader::Bool16x8_1Int16x8_2_Medium(reader);
    DumpBool16x8_1Int16x8_2<Js::OpLayoutT_Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00185,dumpFunction,reader);
    return;
  case 0x160:
    data_x00530 = ByteCodeReader::Int16x8_1Bool16x8_1Int16x8_2_Medium(reader);
    DumpInt16x8_1Bool16x8_1Int16x8_2<Js::OpLayoutT_Int16x8_1Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00530,dumpFunction,reader);
    return;
  case 0x161:
    data_x00352 = ByteCodeReader::Int16x8_2Int1_Medium(reader);
    DumpInt16x8_2Int1<Js::OpLayoutT_Int16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00352,dumpFunction,reader);
    return;
  case 0x162:
    data_x00515 = ByteCodeReader::Int16x8_1Float32x4_1_Medium(reader);
    DumpInt16x8_1Float32x4_1<Js::OpLayoutT_Int16x8_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00515,dumpFunction,reader);
    return;
  case 0x163:
    data_x00238 = ByteCodeReader::Int16x8_1Int32x4_1_Medium(reader);
    DumpInt16x8_1Int32x4_1<Js::OpLayoutT_Int16x8_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00238,dumpFunction,reader);
    return;
  case 0x164:
    data_x00529 = ByteCodeReader::Int16x8_1Int8x16_1_Medium(reader);
    DumpInt16x8_1Int8x16_1<Js::OpLayoutT_Int16x8_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00529,dumpFunction,reader);
    return;
  case 0x165:
    data_x00545 = ByteCodeReader::Int16x8_1Uint32x4_1_Medium(reader);
    DumpInt16x8_1Uint32x4_1<Js::OpLayoutT_Int16x8_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00545,dumpFunction,reader);
    return;
  case 0x166:
    data_x00492 = ByteCodeReader::Int16x8_1Uint16x8_1_Medium(reader);
    DumpInt16x8_1Uint16x8_1<Js::OpLayoutT_Int16x8_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00492,dumpFunction,reader);
    return;
  case 0x167:
    data_x00311 = ByteCodeReader::Int16x8_1Uint8x16_1_Medium(reader);
    DumpInt16x8_1Uint8x16_1<Js::OpLayoutT_Int16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00311,dumpFunction,reader);
    return;
  case 0x168:
    data_x00264 = ByteCodeReader::Int8x16_2_Medium(reader);
    DumpInt8x16_2<Js::OpLayoutT_Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00264,dumpFunction,reader);
    return;
  case 0x169:
    data_x00498 = ByteCodeReader::Int8x16_3_Medium(reader);
    DumpInt8x16_3<Js::OpLayoutT_Int8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00498,dumpFunction,reader);
    return;
  case 0x16a:
    data_x00205 = ByteCodeReader::Int8x16_1Int16_Medium(reader);
    DumpInt8x16_1Int16<Js::OpLayoutT_Int8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00205,dumpFunction,reader);
    return;
  case 0x16b:
    data_x00513 = ByteCodeReader::Int8x16_2Int16_Medium(reader);
    DumpInt8x16_2Int16<Js::OpLayoutT_Int8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00513,dumpFunction,reader);
    return;
  case 0x16c:
    data_x00593 = ByteCodeReader::Int8x16_3Int16_Medium(reader);
    DumpInt8x16_3Int16<Js::OpLayoutT_Int8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00593,dumpFunction,reader);
    return;
  case 0x16d:
    data_x00109 = ByteCodeReader::Int8x16_1Int1_Medium(reader);
    DumpInt8x16_1Int1<Js::OpLayoutT_Int8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00109,dumpFunction,reader);
    return;
  case 0x16e:
    data_x00519 = ByteCodeReader::Int8x16_2Int1_Medium(reader);
    DumpInt8x16_2Int1<Js::OpLayoutT_Int8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00519,dumpFunction,reader);
    return;
  case 0x16f:
    data_x00565 = ByteCodeReader::Reg1Int8x16_1_Medium(reader);
    DumpReg1Int8x16_1<Js::OpLayoutT_Reg1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00565,dumpFunction,reader);
    return;
  case 0x170:
    data_x00557 = ByteCodeReader::Bool8x16_1Int8x16_2_Medium(reader);
    DumpBool8x16_1Int8x16_2<Js::OpLayoutT_Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00557,dumpFunction,reader);
    return;
  case 0x171:
    data_x00588 = ByteCodeReader::Int8x16_1Bool8x16_1Int8x16_2_Medium(reader);
    DumpInt8x16_1Bool8x16_1Int8x16_2<Js::OpLayoutT_Int8x16_1Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00588,dumpFunction,reader);
    return;
  case 0x172:
    data_x00213 = ByteCodeReader::Int8x16_1Float32x4_1_Medium(reader);
    DumpInt8x16_1Float32x4_1<Js::OpLayoutT_Int8x16_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00213,dumpFunction,reader);
    return;
  case 0x173:
    data_x00462 = ByteCodeReader::Int8x16_1Int32x4_1_Medium(reader);
    DumpInt8x16_1Int32x4_1<Js::OpLayoutT_Int8x16_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00462,dumpFunction,reader);
    return;
  case 0x174:
    data_x00586 = ByteCodeReader::Int8x16_1Int16x8_1_Medium(reader);
    DumpInt8x16_1Int16x8_1<Js::OpLayoutT_Int8x16_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00586,dumpFunction,reader);
    return;
  case 0x175:
    data_x00458 = ByteCodeReader::Int8x16_1Uint32x4_1_Medium(reader);
    DumpInt8x16_1Uint32x4_1<Js::OpLayoutT_Int8x16_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00458,dumpFunction,reader);
    return;
  case 0x176:
    data_88 = ByteCodeReader::Int8x16_1Uint16x8_1_Medium(reader);
    DumpInt8x16_1Uint16x8_1<Js::OpLayoutT_Int8x16_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_88,dumpFunction,reader);
    return;
  case 0x177:
    data_x00531 = ByteCodeReader::Int8x16_1Uint8x16_1_Medium(reader);
    DumpInt8x16_1Uint8x16_1<Js::OpLayoutT_Int8x16_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00531,dumpFunction,reader);
    return;
  case 0x178:
    data_64 = ByteCodeReader::Int1Int8x16_1Int1_Medium(reader);
    DumpInt1Int8x16_1Int1<Js::OpLayoutT_Int1Int8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_64,dumpFunction,reader);
    return;
  case 0x179:
    data_x00139 = ByteCodeReader::Int8x16_2Int2_Medium(reader);
    DumpInt8x16_2Int2<Js::OpLayoutT_Int8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00139,dumpFunction,reader);
    return;
  case 0x17a:
    data_x00587 = ByteCodeReader::Uint32x4_1Int4_Medium(reader);
    DumpUint32x4_1Int4<Js::OpLayoutT_Uint32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00587,dumpFunction,reader);
    return;
  case 0x17b:
    data_x00304 = ByteCodeReader::Reg1Uint32x4_1_Medium(reader);
    DumpReg1Uint32x4_1<Js::OpLayoutT_Reg1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00304,dumpFunction,reader);
    return;
  case 0x17c:
    data_x00256 = ByteCodeReader::Uint32x4_2_Medium(reader);
    DumpUint32x4_2<Js::OpLayoutT_Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00256,dumpFunction,reader);
    return;
  case 0x17d:
    data_x00149 = ByteCodeReader::Int1Uint32x4_1Int1_Medium(reader);
    DumpInt1Uint32x4_1Int1<Js::OpLayoutT_Int1Uint32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00149,dumpFunction,reader);
    return;
  case 0x17e:
    data_x00331 = ByteCodeReader::Uint32x4_2Int4_Medium(reader);
    DumpUint32x4_2Int4<Js::OpLayoutT_Uint32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00331,dumpFunction,reader);
    return;
  case 0x17f:
    data_x00486 = ByteCodeReader::Uint32x4_3Int4_Medium(reader);
    DumpUint32x4_3Int4<Js::OpLayoutT_Uint32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00486,dumpFunction,reader);
    return;
  case 0x180:
    data_x00175 = ByteCodeReader::Uint32x4_1Int1_Medium(reader);
    DumpUint32x4_1Int1<Js::OpLayoutT_Uint32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00175,dumpFunction,reader);
    return;
  case 0x181:
    data_75 = ByteCodeReader::Uint32x4_2Int2_Medium(reader);
    DumpUint32x4_2Int2<Js::OpLayoutT_Uint32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_75,dumpFunction,reader);
    return;
  case 0x182:
    data_x00283 = ByteCodeReader::Uint32x4_3_Medium(reader);
    DumpUint32x4_3<Js::OpLayoutT_Uint32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00283,dumpFunction,reader);
    return;
  case 0x183:
    data_x00118 = ByteCodeReader::Bool32x4_1Uint32x4_2_Medium(reader);
    DumpBool32x4_1Uint32x4_2<Js::OpLayoutT_Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00118,dumpFunction,reader);
    return;
  case 0x184:
    data_x00548 = ByteCodeReader::Uint32x4_1Bool32x4_1Uint32x4_2_Medium(reader);
    DumpUint32x4_1Bool32x4_1Uint32x4_2<Js::OpLayoutT_Uint32x4_1Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00548,dumpFunction,reader);
    return;
  case 0x185:
    data_92 = ByteCodeReader::Uint32x4_2Int1_Medium(reader);
    DumpUint32x4_2Int1<Js::OpLayoutT_Uint32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_92,dumpFunction,reader);
    return;
  case 0x186:
    data_x00475 = ByteCodeReader::Uint32x4_1Float32x4_1_Medium(reader);
    DumpUint32x4_1Float32x4_1<Js::OpLayoutT_Uint32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00475,dumpFunction,reader);
    return;
  case 0x187:
    data_x00138 = ByteCodeReader::Uint32x4_1Int32x4_1_Medium(reader);
    DumpUint32x4_1Int32x4_1<Js::OpLayoutT_Uint32x4_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00138,dumpFunction,reader);
    return;
  case 0x188:
    data_x00421 = ByteCodeReader::Uint32x4_1Int16x8_1_Medium(reader);
    DumpUint32x4_1Int16x8_1<Js::OpLayoutT_Uint32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00421,dumpFunction,reader);
    return;
  case 0x189:
    data_x00223 = ByteCodeReader::Uint32x4_1Int8x16_1_Medium(reader);
    DumpUint32x4_1Int8x16_1<Js::OpLayoutT_Uint32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00223,dumpFunction,reader);
    return;
  case 0x18a:
    data_x00385 = ByteCodeReader::Uint32x4_1Uint16x8_1_Medium(reader);
    DumpUint32x4_1Uint16x8_1<Js::OpLayoutT_Uint32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00385,dumpFunction,reader);
    return;
  case 0x18b:
    data_x00521 = ByteCodeReader::Uint32x4_1Uint8x16_1_Medium(reader);
    DumpUint32x4_1Uint8x16_1<Js::OpLayoutT_Uint32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00521,dumpFunction,reader);
    return;
  case 0x18c:
    data_x00590 = ByteCodeReader::Uint16x8_1Int8_Medium(reader);
    DumpUint16x8_1Int8<Js::OpLayoutT_Uint16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00590,dumpFunction,reader);
    return;
  case 0x18d:
    data_x00570 = ByteCodeReader::Reg1Uint16x8_1_Medium(reader);
    DumpReg1Uint16x8_1<Js::OpLayoutT_Reg1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00570,dumpFunction,reader);
    return;
  case 0x18e:
    data_x00429 = ByteCodeReader::Uint16x8_2_Medium(reader);
    DumpUint16x8_2<Js::OpLayoutT_Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00429,dumpFunction,reader);
    return;
  case 399:
    data_x00550 = ByteCodeReader::Int1Uint16x8_1Int1_Medium(reader);
    DumpInt1Uint16x8_1Int1<Js::OpLayoutT_Int1Uint16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00550,dumpFunction,reader);
    return;
  case 400:
    data_x00468 = ByteCodeReader::Uint16x8_2Int8_Medium(reader);
    DumpUint16x8_2Int8<Js::OpLayoutT_Uint16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00468,dumpFunction,reader);
    return;
  case 0x191:
    data_x00575 = ByteCodeReader::Uint16x8_3Int8_Medium(reader);
    DumpUint16x8_3Int8<Js::OpLayoutT_Uint16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00575,dumpFunction,reader);
    return;
  case 0x192:
    data_x00506 = ByteCodeReader::Uint16x8_1Int1_Medium(reader);
    DumpUint16x8_1Int1<Js::OpLayoutT_Uint16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00506,dumpFunction,reader);
    return;
  case 0x193:
    data_86 = ByteCodeReader::Uint16x8_2Int2_Medium(reader);
    DumpUint16x8_2Int2<Js::OpLayoutT_Uint16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_86,dumpFunction,reader);
    return;
  case 0x194:
    data_x00583 = ByteCodeReader::Uint16x8_3_Medium(reader);
    DumpUint16x8_3<Js::OpLayoutT_Uint16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00583,dumpFunction,reader);
    return;
  case 0x195:
    data_x00318 = ByteCodeReader::Bool16x8_1Uint16x8_2_Medium(reader);
    DumpBool16x8_1Uint16x8_2<Js::OpLayoutT_Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00318,dumpFunction,reader);
    return;
  case 0x196:
    data_x00536 = ByteCodeReader::Uint16x8_1Bool16x8_1Uint16x8_2_Medium(reader);
    DumpUint16x8_1Bool16x8_1Uint16x8_2<Js::OpLayoutT_Uint16x8_1Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00536,dumpFunction,reader);
    return;
  case 0x197:
    data_82 = ByteCodeReader::Uint16x8_2Int1_Medium(reader);
    DumpUint16x8_2Int1<Js::OpLayoutT_Uint16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_82,dumpFunction,reader);
    return;
  case 0x198:
    data_x00194 = ByteCodeReader::Uint16x8_1Float32x4_1_Medium(reader);
    DumpUint16x8_1Float32x4_1<Js::OpLayoutT_Uint16x8_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00194,dumpFunction,reader);
    return;
  case 0x199:
    data_x00571 = ByteCodeReader::Uint16x8_1Int32x4_1_Medium(reader);
    DumpUint16x8_1Int32x4_1<Js::OpLayoutT_Uint16x8_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00571,dumpFunction,reader);
    return;
  case 0x19a:
    data_91 = ByteCodeReader::Uint16x8_1Int16x8_1_Medium(reader);
    DumpUint16x8_1Int16x8_1<Js::OpLayoutT_Uint16x8_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_91,dumpFunction,reader);
    return;
  case 0x19b:
    data_x00581 = ByteCodeReader::Uint16x8_1Int8x16_1_Medium(reader);
    DumpUint16x8_1Int8x16_1<Js::OpLayoutT_Uint16x8_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00581,dumpFunction,reader);
    return;
  case 0x19c:
    data_x00578 = ByteCodeReader::Uint16x8_1Uint32x4_1_Medium(reader);
    DumpUint16x8_1Uint32x4_1<Js::OpLayoutT_Uint16x8_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00578,dumpFunction,reader);
    return;
  case 0x19d:
    data_x00228 = ByteCodeReader::Uint16x8_1Uint8x16_1_Medium(reader);
    DumpUint16x8_1Uint8x16_1<Js::OpLayoutT_Uint16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00228,dumpFunction,reader);
    return;
  case 0x19e:
    data_x00459 = ByteCodeReader::Uint8x16_1Int16_Medium(reader);
    DumpUint8x16_1Int16<Js::OpLayoutT_Uint8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00459,dumpFunction,reader);
    return;
  case 0x19f:
    data_x00101 = ByteCodeReader::Reg1Uint8x16_1_Medium(reader);
    DumpReg1Uint8x16_1<Js::OpLayoutT_Reg1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00101,dumpFunction,reader);
    return;
  case 0x1a0:
    data_x00131 = ByteCodeReader::Uint8x16_2_Medium(reader);
    DumpUint8x16_2<Js::OpLayoutT_Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00131,dumpFunction,reader);
    return;
  case 0x1a1:
    data_x00240 = ByteCodeReader::Int1Uint8x16_1Int1_Medium(reader);
    DumpInt1Uint8x16_1Int1<Js::OpLayoutT_Int1Uint8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00240,dumpFunction,reader);
    return;
  case 0x1a2:
    data_x00161 = ByteCodeReader::Uint8x16_2Int16_Medium(reader);
    DumpUint8x16_2Int16<Js::OpLayoutT_Uint8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00161,dumpFunction,reader);
    return;
  case 0x1a3:
    data_x00210 = ByteCodeReader::Uint8x16_3Int16_Medium(reader);
    DumpUint8x16_3Int16<Js::OpLayoutT_Uint8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00210,dumpFunction,reader);
    return;
  case 0x1a4:
    data_x00152 = ByteCodeReader::Uint8x16_1Int1_Medium(reader);
    DumpUint8x16_1Int1<Js::OpLayoutT_Uint8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00152,dumpFunction,reader);
    return;
  case 0x1a5:
    data_x00418 = ByteCodeReader::Uint8x16_2Int2_Medium(reader);
    DumpUint8x16_2Int2<Js::OpLayoutT_Uint8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00418,dumpFunction,reader);
    return;
  case 0x1a6:
    data_x00573 = ByteCodeReader::Uint8x16_3_Medium(reader);
    DumpUint8x16_3<Js::OpLayoutT_Uint8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00573,dumpFunction,reader);
    return;
  case 0x1a7:
    data_x00134 = ByteCodeReader::Bool8x16_1Uint8x16_2_Medium(reader);
    DumpBool8x16_1Uint8x16_2<Js::OpLayoutT_Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00134,dumpFunction,reader);
    return;
  case 0x1a8:
    data_x00582 = ByteCodeReader::Uint8x16_1Bool8x16_1Uint8x16_2_Medium(reader);
    DumpUint8x16_1Bool8x16_1Uint8x16_2<Js::OpLayoutT_Uint8x16_1Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00582,dumpFunction,reader);
    return;
  case 0x1a9:
    data_x00126 = ByteCodeReader::Uint8x16_2Int1_Medium(reader);
    DumpUint8x16_2Int1<Js::OpLayoutT_Uint8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00126,dumpFunction,reader);
    return;
  case 0x1aa:
    data_x00376 = ByteCodeReader::Uint8x16_1Float32x4_1_Medium(reader);
    DumpUint8x16_1Float32x4_1<Js::OpLayoutT_Uint8x16_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00376,dumpFunction,reader);
    return;
  case 0x1ab:
    data_78 = ByteCodeReader::Uint8x16_1Int32x4_1_Medium(reader);
    DumpUint8x16_1Int32x4_1<Js::OpLayoutT_Uint8x16_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_78,dumpFunction,reader);
    return;
  case 0x1ac:
    data_x00310 = ByteCodeReader::Uint8x16_1Int16x8_1_Medium(reader);
    DumpUint8x16_1Int16x8_1<Js::OpLayoutT_Uint8x16_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00310,dumpFunction,reader);
    return;
  case 0x1ad:
    data_81 = ByteCodeReader::Uint8x16_1Int8x16_1_Medium(reader);
    DumpUint8x16_1Int8x16_1<Js::OpLayoutT_Uint8x16_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_81,dumpFunction,reader);
    return;
  case 0x1ae:
    data_x00380 = ByteCodeReader::Uint8x16_1Uint32x4_1_Medium(reader);
    DumpUint8x16_1Uint32x4_1<Js::OpLayoutT_Uint8x16_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00380,dumpFunction,reader);
    return;
  case 0x1af:
    data_x00129 = ByteCodeReader::Uint8x16_1Uint16x8_1_Medium(reader);
    DumpUint8x16_1Uint16x8_1<Js::OpLayoutT_Uint8x16_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00129,dumpFunction,reader);
    return;
  case 0x1b0:
    data_87 = ByteCodeReader::Bool32x4_1Int1_Medium(reader);
    DumpBool32x4_1Int1<Js::OpLayoutT_Bool32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_87,dumpFunction,reader);
    return;
  case 0x1b1:
    data_x00155 = ByteCodeReader::Bool32x4_1Int4_Medium(reader);
    DumpBool32x4_1Int4<Js::OpLayoutT_Bool32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00155,dumpFunction,reader);
    return;
  case 0x1b2:
    data_x00114 = ByteCodeReader::Int1Bool32x4_1Int1_Medium(reader);
    DumpInt1Bool32x4_1Int1<Js::OpLayoutT_Int1Bool32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00114,dumpFunction,reader);
    return;
  case 0x1b3:
    data_x00526 = ByteCodeReader::Bool32x4_2Int2_Medium(reader);
    DumpBool32x4_2Int2<Js::OpLayoutT_Bool32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00526,dumpFunction,reader);
    return;
  case 0x1b4:
    data_x00503 = ByteCodeReader::Int1Bool32x4_1_Medium(reader);
    DumpInt1Bool32x4_1<Js::OpLayoutT_Int1Bool32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00503,dumpFunction,reader);
    return;
  case 0x1b5:
    data_x00169 = ByteCodeReader::Bool32x4_2_Medium(reader);
    DumpBool32x4_2<Js::OpLayoutT_Bool32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00169,dumpFunction,reader);
    return;
  case 0x1b6:
    data_x00524 = ByteCodeReader::Bool32x4_3_Medium(reader);
    DumpBool32x4_3<Js::OpLayoutT_Bool32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00524,dumpFunction,reader);
    return;
  case 0x1b7:
    data_x00544 = ByteCodeReader::Reg1Bool32x4_1_Medium(reader);
    DumpReg1Bool32x4_1<Js::OpLayoutT_Reg1Bool32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00544,dumpFunction,reader);
    return;
  case 0x1b8:
    data_x00569 = ByteCodeReader::Bool16x8_1Int1_Medium(reader);
    DumpBool16x8_1Int1<Js::OpLayoutT_Bool16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00569,dumpFunction,reader);
    return;
  case 0x1b9:
    data_x00502 = ByteCodeReader::Bool16x8_1Int8_Medium(reader);
    DumpBool16x8_1Int8<Js::OpLayoutT_Bool16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00502,dumpFunction,reader);
    return;
  case 0x1ba:
    data_x00538 = ByteCodeReader::Int1Bool16x8_1Int1_Medium(reader);
    DumpInt1Bool16x8_1Int1<Js::OpLayoutT_Int1Bool16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00538,dumpFunction,reader);
    return;
  case 0x1bb:
    data_99 = ByteCodeReader::Bool16x8_2Int2_Medium(reader);
    DumpBool16x8_2Int2<Js::OpLayoutT_Bool16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_99,dumpFunction,reader);
    return;
  case 0x1bc:
    data_x00104 = ByteCodeReader::Int1Bool16x8_1_Medium(reader);
    DumpInt1Bool16x8_1<Js::OpLayoutT_Int1Bool16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00104,dumpFunction,reader);
    return;
  case 0x1bd:
    data_x00494 = ByteCodeReader::Bool16x8_2_Medium(reader);
    DumpBool16x8_2<Js::OpLayoutT_Bool16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00494,dumpFunction,reader);
    return;
  case 0x1be:
    data_x00105 = ByteCodeReader::Bool16x8_3_Medium(reader);
    DumpBool16x8_3<Js::OpLayoutT_Bool16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00105,dumpFunction,reader);
    return;
  case 0x1bf:
    data_x00556 = ByteCodeReader::Reg1Bool16x8_1_Medium(reader);
    DumpReg1Bool16x8_1<Js::OpLayoutT_Reg1Bool16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00556,dumpFunction,reader);
    return;
  case 0x1c0:
    data_x00298 = ByteCodeReader::Bool8x16_1Int1_Medium(reader);
    DumpBool8x16_1Int1<Js::OpLayoutT_Bool8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00298,dumpFunction,reader);
    return;
  case 0x1c1:
    data_x00508 = ByteCodeReader::Bool8x16_1Int16_Medium(reader);
    DumpBool8x16_1Int16<Js::OpLayoutT_Bool8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00508,dumpFunction,reader);
    return;
  case 0x1c2:
    data_x00112 = ByteCodeReader::Int1Bool8x16_1_Medium(reader);
    DumpInt1Bool8x16_1<Js::OpLayoutT_Int1Bool8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00112,dumpFunction,reader);
    return;
  case 0x1c3:
    data_x00346 = ByteCodeReader::Int1Bool8x16_1Int1_Medium(reader);
    DumpInt1Bool8x16_1Int1<Js::OpLayoutT_Int1Bool8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00346,dumpFunction,reader);
    return;
  case 0x1c4:
    data_x00381 = ByteCodeReader::Bool8x16_2Int2_Medium(reader);
    DumpBool8x16_2Int2<Js::OpLayoutT_Bool8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00381,dumpFunction,reader);
    return;
  case 0x1c5:
    data_x00330 = ByteCodeReader::Bool8x16_2_Medium(reader);
    DumpBool8x16_2<Js::OpLayoutT_Bool8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00330,dumpFunction,reader);
    return;
  case 0x1c6:
    data_x00551 = ByteCodeReader::Bool8x16_3_Medium(reader);
    DumpBool8x16_3<Js::OpLayoutT_Bool8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00551,dumpFunction,reader);
    return;
  case 0x1c7:
    data_x00209 = ByteCodeReader::Reg1Bool8x16_1_Medium(reader);
    DumpReg1Bool8x16_1<Js::OpLayoutT_Reg1Bool8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00209,dumpFunction,reader);
    return;
  case 0x1c8:
    data_x00255 = ByteCodeReader::AsmSimdTypedArr_Medium(reader);
    DumpAsmSimdTypedArr<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00255,dumpFunction,reader);
    return;
  case 0x1c9:
    data_x00534 = ByteCodeReader::AsmShuffle_Medium(reader);
    DumpAsmShuffle<Js::OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00534,dumpFunction,reader);
    return;
  case 0x1ca:
    data_x00377 = ByteCodeReader::ElementSlot_Large(reader);
    DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00377,dumpFunction,reader);
    return;
  case 0x1cd:
    data_x00171 = ByteCodeReader::AsmTypedArr_Large(reader);
    DumpAsmTypedArr<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00171,dumpFunction,reader);
    return;
  case 0x1ce:
    data_x00119 = ByteCodeReader::WasmMemAccess_Large(reader);
    DumpWasmMemAccess<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00119,dumpFunction,reader);
    return;
  case 0x1cf:
    data_x00108 = ByteCodeReader::AsmCall_Large(reader);
    DumpAsmCall<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00108,dumpFunction,reader);
    return;
  case 0x1d0:
    data_x00179 = ByteCodeReader::ProfiledAsmCall_Large(reader);
    DumpProfiledAsmCall<Js::OpLayoutDynamicProfile<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>__unaligned>
              (op,data_x00179,dumpFunction,reader);
    return;
  case 0x1d2:
    pOVar7 = ByteCodeReader::AsmReg1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar7->R0);
    return;
  case 0x1d3:
    data_x00512 = ByteCodeReader::AsmReg2_Large(reader);
    DumpAsmReg2<Js::OpLayoutT_AsmReg2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00512,dumpFunction,reader);
    return;
  case 0x1d4:
    data_x00539 = ByteCodeReader::AsmReg3_Large(reader);
    DumpAsmReg3<Js::OpLayoutT_AsmReg3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00539,dumpFunction,reader);
    return;
  case 0x1d5:
    data_x00541 = ByteCodeReader::AsmReg4_Large(reader);
    DumpAsmReg4<Js::OpLayoutT_AsmReg4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00541,dumpFunction,reader);
    return;
  case 0x1d6:
    data_x00332 = ByteCodeReader::AsmReg5_Large(reader);
    DumpAsmReg5<Js::OpLayoutT_AsmReg5<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00332,dumpFunction,reader);
    return;
  case 0x1d7:
    data_x00257 = ByteCodeReader::AsmReg6_Large(reader);
    DumpAsmReg6<Js::OpLayoutT_AsmReg6<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00257,dumpFunction,reader);
    return;
  case 0x1d8:
    data_x00382 = ByteCodeReader::AsmReg7_Large(reader);
    DumpAsmReg7<Js::OpLayoutT_AsmReg7<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00382,dumpFunction,reader);
    return;
  case 0x1d9:
    data_x00510 = ByteCodeReader::AsmReg9_Large(reader);
    DumpAsmReg9<Js::OpLayoutT_AsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00510,dumpFunction,reader);
    return;
  case 0x1da:
    data_x00218 = ByteCodeReader::AsmReg10_Large(reader);
    DumpAsmReg10<Js::OpLayoutT_AsmReg10<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00218,dumpFunction,reader);
    return;
  case 0x1db:
    data_x00214 = ByteCodeReader::AsmReg11_Large(reader);
    DumpAsmReg11<Js::OpLayoutT_AsmReg11<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00214,dumpFunction,reader);
    return;
  case 0x1dc:
    data_x00135 = ByteCodeReader::AsmReg17_Large(reader);
    DumpAsmReg17<Js::OpLayoutT_AsmReg17<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00135,dumpFunction,reader);
    return;
  case 0x1dd:
    data_x00132 = ByteCodeReader::AsmReg18_Large(reader);
    DumpAsmReg18<Js::OpLayoutT_AsmReg18<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00132,dumpFunction,reader);
    return;
  case 0x1de:
    data_x00523 = ByteCodeReader::AsmReg19_Large(reader);
    DumpAsmReg19<Js::OpLayoutT_AsmReg19<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00523,dumpFunction,reader);
    return;
  case 0x1df:
    data_x00136 = ByteCodeReader::Int1Double1_Large(reader);
    DumpInt1Double1<Js::OpLayoutT_Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00136,dumpFunction,reader);
    return;
  case 0x1e0:
    data_x00449 = ByteCodeReader::Int1Float1_Large(reader);
    DumpInt1Float1<Js::OpLayoutT_Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00449,dumpFunction,reader);
    return;
  case 0x1e1:
    data_x00250 = ByteCodeReader::Double1Const1_Large(reader);
    DumpDouble1Const1<Js::OpLayoutT_Double1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00250,dumpFunction,reader);
    return;
  case 0x1e2:
    data_x00308 = ByteCodeReader::Double1Int1_Large(reader);
    DumpDouble1Int1<Js::OpLayoutT_Double1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00308,dumpFunction,reader);
    return;
  case 0x1e3:
    data_x00142 = ByteCodeReader::Double1Float1_Large(reader);
    DumpDouble1Float1<Js::OpLayoutT_Double1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00142,dumpFunction,reader);
    return;
  case 0x1e4:
    data_x00463 = ByteCodeReader::Double1Reg1_Large(reader);
    DumpDouble1Reg1<Js::OpLayoutT_Double1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00463,dumpFunction,reader);
    return;
  case 0x1e5:
    data_x00457 = ByteCodeReader::Float1Reg1_Large(reader);
    DumpFloat1Reg1<Js::OpLayoutT_Float1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00457,dumpFunction,reader);
    return;
  case 0x1e6:
    data_x00485 = ByteCodeReader::Int1Reg1_Large(reader);
    DumpInt1Reg1<Js::OpLayoutT_Int1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00485,dumpFunction,reader);
    return;
  case 0x1e7:
    data_x00481 = ByteCodeReader::Reg1Double1_Large(reader);
    DumpReg1Double1<Js::OpLayoutT_Reg1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00481,dumpFunction,reader);
    return;
  case 0x1e8:
    data_x00428 = ByteCodeReader::Reg1Float1_Large(reader);
    DumpReg1Float1<Js::OpLayoutT_Reg1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00428,dumpFunction,reader);
    return;
  case 0x1e9:
    data_x00334 = ByteCodeReader::Reg1Int1_Large(reader);
    DumpReg1Int1<Js::OpLayoutT_Reg1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00334,dumpFunction,reader);
    return;
  case 0x1ea:
    data_x00473 = ByteCodeReader::Int1Const1_Large(reader);
    DumpInt1Const1<Js::OpLayoutT_Int1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00473,dumpFunction,reader);
    return;
  case 0x1eb:
    data_x00472 = ByteCodeReader::Reg1IntConst1_Large(reader);
    DumpReg1IntConst1<Js::OpLayoutT_Reg1IntConst1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00472,dumpFunction,reader);
    return;
  case 0x1ec:
    data_x00148 = ByteCodeReader::Int1Double2_Large(reader);
    DumpInt1Double2<Js::OpLayoutT_Int1Double2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00148,dumpFunction,reader);
    return;
  case 0x1ed:
    data_x00505 = ByteCodeReader::Int1Float2_Large(reader);
    DumpInt1Float2<Js::OpLayoutT_Int1Float2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00505,dumpFunction,reader);
    return;
  case 0x1ee:
    data_x00493 = ByteCodeReader::Int2_Large(reader);
    DumpInt2<Js::OpLayoutT_Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00493,dumpFunction,reader);
    return;
  case 0x1ef:
    data_x00153 = ByteCodeReader::Int3_Large(reader);
    DumpInt3<Js::OpLayoutT_Int3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00153,dumpFunction,reader);
    return;
  case 0x1f0:
    data_x00244 = ByteCodeReader::Double2_Large(reader);
    DumpDouble2<Js::OpLayoutT_Double2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00244,dumpFunction,reader);
    return;
  case 0x1f1:
    data_x00123 = ByteCodeReader::Float2_Large(reader);
    DumpFloat2<Js::OpLayoutT_Float2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00123,dumpFunction,reader);
    return;
  case 0x1f2:
    data_x00504 = ByteCodeReader::Float3_Large(reader);
    DumpFloat3<Js::OpLayoutT_Float3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00504,dumpFunction,reader);
    return;
  case 499:
    data_x00509 = ByteCodeReader::Float1Const1_Large(reader);
    DumpFloat1Const1<Js::OpLayoutT_Float1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00509,dumpFunction,reader);
    return;
  case 500:
    data_x00191 = ByteCodeReader::Float1Double1_Large(reader);
    DumpFloat1Double1<Js::OpLayoutT_Float1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00191,dumpFunction,reader);
    return;
  case 0x1f5:
    data_x00328 = ByteCodeReader::Float1Int1_Large(reader);
    DumpFloat1Int1<Js::OpLayoutT_Float1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00328,dumpFunction,reader);
    return;
  case 0x1f6:
    data_x00176 = ByteCodeReader::Double3_Large(reader);
    DumpDouble3<Js::OpLayoutT_Double3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00176,dumpFunction,reader);
    return;
  case 0x1f7:
    data_x00197 = ByteCodeReader::BrInt1_Large(reader);
    DumpBrInt1<Js::OpLayoutT_BrInt1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00197,dumpFunction,reader);
    return;
  case 0x1f8:
    data_x00497 = ByteCodeReader::BrInt2_Large(reader);
    DumpBrInt2<Js::OpLayoutT_BrInt2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00497,dumpFunction,reader);
    return;
  case 0x1f9:
    data_x00164 = ByteCodeReader::BrInt1Const1_Large(reader);
    DumpBrInt1Const1<Js::OpLayoutT_BrInt1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00164,dumpFunction,reader);
    return;
  case 0x1fa:
    pOVar9 = (OpLayoutWasmLoopStart_Large *)ByteCodeReader::AsmUnsigned1_Large(reader);
    goto LAB_0072f697;
  case 0x1fb:
    pOVar9 = ByteCodeReader::WasmLoopStart_Large(reader);
LAB_0072f697:
    value = pOVar9->loopId;
    goto LAB_00731d7e;
  case 0x1fc:
    data_x00500 = ByteCodeReader::Long1Reg1_Large(reader);
    DumpLong1Reg1<Js::OpLayoutT_Long1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00500,dumpFunction,reader);
    return;
  case 0x1fd:
    data_x00247 = ByteCodeReader::Reg1Long1_Large(reader);
    DumpReg1Long1<Js::OpLayoutT_Reg1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00247,dumpFunction,reader);
    return;
  case 0x1fe:
    data_x00303 = ByteCodeReader::Long1Const1_Large(reader);
    DumpLong1Const1<Js::OpLayoutT_Long1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00303,dumpFunction,reader);
    return;
  case 0x1ff:
    data_x00156 = ByteCodeReader::Long2_Large(reader);
    DumpLong2<Js::OpLayoutT_Long2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00156,dumpFunction,reader);
    return;
  case 0x200:
    data_x00430 = ByteCodeReader::Long3_Large(reader);
    DumpLong3<Js::OpLayoutT_Long3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00430,dumpFunction,reader);
    return;
  case 0x201:
    data_x00387 = ByteCodeReader::Int1Long2_Large(reader);
    DumpInt1Long2<Js::OpLayoutT_Int1Long2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00387,dumpFunction,reader);
    return;
  case 0x202:
    data_x00482 = ByteCodeReader::Long1Int1_Large(reader);
    DumpLong1Int1<Js::OpLayoutT_Long1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00482,dumpFunction,reader);
    return;
  case 0x203:
    data_x00384 = ByteCodeReader::Int1Long1_Large(reader);
    DumpInt1Long1<Js::OpLayoutT_Int1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00384,dumpFunction,reader);
    return;
  case 0x204:
    data_x00260 = ByteCodeReader::Long1Float1_Large(reader);
    DumpLong1Float1<Js::OpLayoutT_Long1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00260,dumpFunction,reader);
    return;
  case 0x205:
    data_x00195 = ByteCodeReader::Float1Long1_Large(reader);
    DumpFloat1Long1<Js::OpLayoutT_Float1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00195,dumpFunction,reader);
    return;
  case 0x206:
    data_x00233 = ByteCodeReader::Long1Double1_Large(reader);
    DumpLong1Double1<Js::OpLayoutT_Long1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00233,dumpFunction,reader);
    return;
  case 0x207:
    data_x00204 = ByteCodeReader::Double1Long1_Large(reader);
    DumpDouble1Long1<Js::OpLayoutT_Double1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00204,dumpFunction,reader);
    return;
  case 0x208:
    data_x00140 = ByteCodeReader::Float32x4_2_Large(reader);
    DumpFloat32x4_2<Js::OpLayoutT_Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00140,dumpFunction,reader);
    return;
  case 0x209:
    data_x00528 = ByteCodeReader::Float32x4_3_Large(reader);
    DumpFloat32x4_3<Js::OpLayoutT_Float32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00528,dumpFunction,reader);
    return;
  case 0x20a:
    data_x00514 = ByteCodeReader::Float32x4_4_Large(reader);
    DumpFloat32x4_4<Js::OpLayoutT_Float32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00514,dumpFunction,reader);
    return;
  case 0x20b:
    data_x00525 = ByteCodeReader::Bool32x4_1Float32x4_2_Large(reader);
    DumpBool32x4_1Float32x4_2<Js::OpLayoutT_Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00525,dumpFunction,reader);
    return;
  case 0x20c:
    data_x00484 = ByteCodeReader::Float32x4_1Bool32x4_1Float32x4_2_Large(reader);
    DumpFloat32x4_1Bool32x4_1Float32x4_2<Js::OpLayoutT_Float32x4_1Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00484,dumpFunction,reader);
    return;
  case 0x20d:
    data_x00259 = ByteCodeReader::Float32x4_1Float4_Large(reader);
    DumpFloat32x4_1Float4<Js::OpLayoutT_Float32x4_1Float4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00259,dumpFunction,reader);
    return;
  case 0x20e:
    data_x00199 = ByteCodeReader::Float32x4_2Int4_Large(reader);
    DumpFloat32x4_2Int4<Js::OpLayoutT_Float32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00199,dumpFunction,reader);
    return;
  case 0x20f:
    data_x00217 = ByteCodeReader::Float32x4_3Int4_Large(reader);
    DumpFloat32x4_3Int4<Js::OpLayoutT_Float32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00217,dumpFunction,reader);
    return;
  case 0x210:
    data_x00518 = ByteCodeReader::Float32x4_1Float1_Large(reader);
    DumpFloat32x4_1Float1<Js::OpLayoutT_Float32x4_1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00518,dumpFunction,reader);
    return;
  case 0x211:
    data_x00165 = ByteCodeReader::Float32x4_2Float1_Large(reader);
    DumpFloat32x4_2Float1<Js::OpLayoutT_Float32x4_2Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00165,dumpFunction,reader);
    return;
  case 0x212:
    data_x00219 = ByteCodeReader::Float32x4_1Int32x4_1_Large(reader);
    DumpFloat32x4_1Int32x4_1<Js::OpLayoutT_Float32x4_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00219,dumpFunction,reader);
    return;
  case 0x213:
    data_x00232 = ByteCodeReader::Float32x4_1Uint32x4_1_Large(reader);
    DumpFloat32x4_1Uint32x4_1<Js::OpLayoutT_Float32x4_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00232,dumpFunction,reader);
    return;
  case 0x214:
    data_x00454 = ByteCodeReader::Float32x4_1Int16x8_1_Large(reader);
    DumpFloat32x4_1Int16x8_1<Js::OpLayoutT_Float32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00454,dumpFunction,reader);
    return;
  case 0x215:
    data_x00338 = ByteCodeReader::Float32x4_1Uint16x8_1_Large(reader);
    DumpFloat32x4_1Uint16x8_1<Js::OpLayoutT_Float32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00338,dumpFunction,reader);
    return;
  case 0x216:
    data_x00237 = ByteCodeReader::Float32x4_1Int8x16_1_Large(reader);
    DumpFloat32x4_1Int8x16_1<Js::OpLayoutT_Float32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00237,dumpFunction,reader);
    return;
  case 0x217:
    data_x00262 = ByteCodeReader::Float32x4_1Uint8x16_1_Large(reader);
    DumpFloat32x4_1Uint8x16_1<Js::OpLayoutT_Float32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00262,dumpFunction,reader);
    return;
  case 0x218:
    data_x00339 = ByteCodeReader::Reg1Float32x4_1_Large(reader);
    DumpReg1Float32x4_1<Js::OpLayoutT_Reg1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00339,dumpFunction,reader);
    return;
  case 0x219:
    data_x00180 = ByteCodeReader::Float1Float32x4_1Int1_Large(reader);
    DumpFloat1Float32x4_1Int1<Js::OpLayoutT_Float1Float32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00180,dumpFunction,reader);
    return;
  case 0x21a:
    data_x00284 = ByteCodeReader::Float32x4_2Int1Float1_Large(reader);
    DumpFloat32x4_2Int1Float1<Js::OpLayoutT_Float32x4_2Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00284,dumpFunction,reader);
    return;
  case 0x21b:
    data_x00182 = ByteCodeReader::Int32x4_2_Large(reader);
    DumpInt32x4_2<Js::OpLayoutT_Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00182,dumpFunction,reader);
    return;
  case 0x21c:
    data_x00476 = ByteCodeReader::Int32x4_3_Large(reader);
    DumpInt32x4_3<Js::OpLayoutT_Int32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00476,dumpFunction,reader);
    return;
  case 0x21d:
    data_x00422 = ByteCodeReader::Int32x4_4_Large(reader);
    DumpInt32x4_4<Js::OpLayoutT_Int32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00422,dumpFunction,reader);
    return;
  case 0x21e:
    data_x00389 = ByteCodeReader::Bool32x4_1Int32x4_2_Large(reader);
    DumpBool32x4_1Int32x4_2<Js::OpLayoutT_Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00389,dumpFunction,reader);
    return;
  case 0x21f:
    data_x00265 = ByteCodeReader::Int32x4_1Bool32x4_1Int32x4_2_Large(reader);
    DumpInt32x4_1Bool32x4_1Int32x4_2<Js::OpLayoutT_Int32x4_1Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00265,dumpFunction,reader);
    return;
  case 0x220:
    data_x00438 = ByteCodeReader::Int32x4_1Int4_Large(reader);
    DumpInt32x4_1Int4<Js::OpLayoutT_Int32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00438,dumpFunction,reader);
    return;
  case 0x221:
    data_x00471 = ByteCodeReader::Int32x4_2Int4_Large(reader);
    DumpInt32x4_2Int4<Js::OpLayoutT_Int32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00471,dumpFunction,reader);
    return;
  case 0x222:
    data_x00511 = ByteCodeReader::Int32x4_3Int4_Large(reader);
    DumpInt32x4_3Int4<Js::OpLayoutT_Int32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00511,dumpFunction,reader);
    return;
  case 0x223:
    data_x00282 = ByteCodeReader::Int32x4_1Int1_Large(reader);
    DumpInt32x4_1Int1<Js::OpLayoutT_Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00282,dumpFunction,reader);
    return;
  case 0x224:
    data_x00188 = ByteCodeReader::Int32x4_2Int1_Large(reader);
    DumpInt32x4_2Int1<Js::OpLayoutT_Int32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00188,dumpFunction,reader);
    return;
  case 0x225:
    data_x00203 = ByteCodeReader::Reg1Int32x4_1_Large(reader);
    DumpReg1Int32x4_1<Js::OpLayoutT_Reg1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00203,dumpFunction,reader);
    return;
  case 0x226:
    data_x00424 = ByteCodeReader::Int32x4_1Float32x4_1_Large(reader);
    DumpInt32x4_1Float32x4_1<Js::OpLayoutT_Int32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00424,dumpFunction,reader);
    return;
  case 0x227:
    data_x00288 = ByteCodeReader::Int32x4_1Uint32x4_1_Large(reader);
    DumpInt32x4_1Uint32x4_1<Js::OpLayoutT_Int32x4_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00288,dumpFunction,reader);
    return;
  case 0x228:
    data_x00467 = ByteCodeReader::Int32x4_1Int16x8_1_Large(reader);
    DumpInt32x4_1Int16x8_1<Js::OpLayoutT_Int32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00467,dumpFunction,reader);
    return;
  case 0x229:
    data_x00487 = ByteCodeReader::Int32x4_1Uint16x8_1_Large(reader);
    DumpInt32x4_1Uint16x8_1<Js::OpLayoutT_Int32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00487,dumpFunction,reader);
    return;
  case 0x22a:
    data_x00167 = ByteCodeReader::Int32x4_1Int8x16_1_Large(reader);
    DumpInt32x4_1Int8x16_1<Js::OpLayoutT_Int32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00167,dumpFunction,reader);
    return;
  case 0x22b:
    data_x00157 = ByteCodeReader::Int32x4_1Uint8x16_1_Large(reader);
    DumpInt32x4_1Uint8x16_1<Js::OpLayoutT_Int32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00157,dumpFunction,reader);
    return;
  case 0x22c:
    data_x00290 = ByteCodeReader::Int1Int32x4_1Int1_Large(reader);
    DumpInt1Int32x4_1Int1<Js::OpLayoutT_Int1Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00290,dumpFunction,reader);
    return;
  case 0x22d:
    data_x00313 = ByteCodeReader::Int32x4_2Int2_Large(reader);
    DumpInt32x4_2Int2<Js::OpLayoutT_Int32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00313,dumpFunction,reader);
    return;
  case 0x22e:
    data_x00391 = ByteCodeReader::Float32x4_IntConst4_Large(reader);
    DumpFloat32x4_IntConst4<Js::OpLayoutT_Float32x4_IntConst4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00391,dumpFunction,reader);
    return;
  case 0x22f:
    data_x00324 = ByteCodeReader::Double1Float64x2_1Int1_Large(reader);
    DumpDouble1Float64x2_1Int1<Js::OpLayoutT_Double1Float64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00324,dumpFunction,reader);
    return;
  case 0x230:
    data_x00390 = ByteCodeReader::Float64x2_2Int1Double1_Large(reader);
    DumpFloat64x2_2Int1Double1<Js::OpLayoutT_Float64x2_2Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00390,dumpFunction,reader);
    return;
  case 0x231:
    data_x00341 = ByteCodeReader::Float64x2_2_Large(reader);
    DumpFloat64x2_2<Js::OpLayoutT_Float64x2_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00341,dumpFunction,reader);
    return;
  case 0x232:
    data_x00431 = ByteCodeReader::Float64x2_3_Large(reader);
    DumpFloat64x2_3<Js::OpLayoutT_Float64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00431,dumpFunction,reader);
    return;
  case 0x233:
    data_x00160 = ByteCodeReader::Float64x2_1Double1_Large(reader);
    DumpFloat64x2_1Double1<Js::OpLayoutT_Float64x2_1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00160,dumpFunction,reader);
    return;
  case 0x234:
    data_x00193 = ByteCodeReader::Int64x2_1Long1_Large(reader);
    DumpInt64x2_1Long1<Js::OpLayoutT_Int64x2_1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00193,dumpFunction,reader);
    return;
  case 0x235:
    data_x00317 = ByteCodeReader::Long1Int64x2_1Int1_Large(reader);
    DumpLong1Int64x2_1Int1<Js::OpLayoutT_Long1Int64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00317,dumpFunction,reader);
    return;
  case 0x236:
    data_x00225 = ByteCodeReader::Int64x2_2_Int1_Long1_Large(reader);
    DumpInt64x2_2_Int1_Long1<Js::OpLayoutT_Int64x2_2_Int1_Long1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00225,dumpFunction,reader);
    return;
  case 0x237:
    data_x00396 = ByteCodeReader::Int64x2_3_Large(reader);
    DumpInt64x2_3<Js::OpLayoutT_Int64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00396,dumpFunction,reader);
    return;
  case 0x238:
    data_x00401 = ByteCodeReader::Int64x2_2_Large(reader);
    DumpInt64x2_2<Js::OpLayoutT_Int64x2_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00401,dumpFunction,reader);
    return;
  case 0x239:
    data_x00306 = ByteCodeReader::Int64x2_2Int1_Large(reader);
    DumpInt64x2_2Int1<Js::OpLayoutT_Int64x2_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00306,dumpFunction,reader);
    return;
  case 0x23a:
    data_x00410 = ByteCodeReader::Int1Bool64x2_1_Large(reader);
    DumpInt1Bool64x2_1<Js::OpLayoutT_Int1Bool64x2_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00410,dumpFunction,reader);
    return;
  case 0x23b:
    data_x00395 = ByteCodeReader::Int16x8_1Int8_Large(reader);
    DumpInt16x8_1Int8<Js::OpLayoutT_Int16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00395,dumpFunction,reader);
    return;
  case 0x23c:
    data_x00263 = ByteCodeReader::Reg1Int16x8_1_Large(reader);
    DumpReg1Int16x8_1<Js::OpLayoutT_Reg1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00263,dumpFunction,reader);
    return;
  case 0x23d:
    data_x00267 = ByteCodeReader::Int16x8_2_Large(reader);
    DumpInt16x8_2<Js::OpLayoutT_Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00267,dumpFunction,reader);
    return;
  case 0x23e:
    data_x00397 = ByteCodeReader::Int1Int16x8_1Int1_Large(reader);
    DumpInt1Int16x8_1Int1<Js::OpLayoutT_Int1Int16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00397,dumpFunction,reader);
    return;
  case 0x23f:
    data_x00423 = ByteCodeReader::Int16x8_2Int8_Large(reader);
    DumpInt16x8_2Int8<Js::OpLayoutT_Int16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00423,dumpFunction,reader);
    return;
  case 0x240:
    data_x00183 = ByteCodeReader::Int16x8_3Int8_Large(reader);
    DumpInt16x8_3Int8<Js::OpLayoutT_Int16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00183,dumpFunction,reader);
    return;
  case 0x241:
    data_x00202 = ByteCodeReader::Int16x8_1Int1_Large(reader);
    DumpInt16x8_1Int1<Js::OpLayoutT_Int16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00202,dumpFunction,reader);
    return;
  case 0x242:
    data_x00266 = ByteCodeReader::Int16x8_2Int2_Large(reader);
    DumpInt16x8_2Int2<Js::OpLayoutT_Int16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00266,dumpFunction,reader);
    return;
  case 0x243:
    data_x00275 = ByteCodeReader::Int16x8_3_Large(reader);
    DumpInt16x8_3<Js::OpLayoutT_Int16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00275,dumpFunction,reader);
    return;
  case 0x244:
    data_x00208 = ByteCodeReader::Bool16x8_1Int16x8_2_Large(reader);
    DumpBool16x8_1Int16x8_2<Js::OpLayoutT_Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00208,dumpFunction,reader);
    return;
  case 0x245:
    data_x00227 = ByteCodeReader::Int16x8_1Bool16x8_1Int16x8_2_Large(reader);
    DumpInt16x8_1Bool16x8_1Int16x8_2<Js::OpLayoutT_Int16x8_1Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00227,dumpFunction,reader);
    return;
  case 0x246:
    data_x00442 = ByteCodeReader::Int16x8_2Int1_Large(reader);
    DumpInt16x8_2Int1<Js::OpLayoutT_Int16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00442,dumpFunction,reader);
    return;
  case 0x247:
    data_x00444 = ByteCodeReader::Int16x8_1Float32x4_1_Large(reader);
    DumpInt16x8_1Float32x4_1<Js::OpLayoutT_Int16x8_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00444,dumpFunction,reader);
    return;
  case 0x248:
    data_x00254 = ByteCodeReader::Int16x8_1Int32x4_1_Large(reader);
    DumpInt16x8_1Int32x4_1<Js::OpLayoutT_Int16x8_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00254,dumpFunction,reader);
    return;
  case 0x249:
    data_x00448 = ByteCodeReader::Int16x8_1Int8x16_1_Large(reader);
    DumpInt16x8_1Int8x16_1<Js::OpLayoutT_Int16x8_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00448,dumpFunction,reader);
    return;
  case 0x24a:
    data_x00461 = ByteCodeReader::Int16x8_1Uint32x4_1_Large(reader);
    DumpInt16x8_1Uint32x4_1<Js::OpLayoutT_Int16x8_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00461,dumpFunction,reader);
    return;
  case 0x24b:
    data_x00488 = ByteCodeReader::Int16x8_1Uint16x8_1_Large(reader);
    DumpInt16x8_1Uint16x8_1<Js::OpLayoutT_Int16x8_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00488,dumpFunction,reader);
    return;
  case 0x24c:
    data_x00354 = ByteCodeReader::Int16x8_1Uint8x16_1_Large(reader);
    DumpInt16x8_1Uint8x16_1<Js::OpLayoutT_Int16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00354,dumpFunction,reader);
    return;
  case 0x24d:
    data_x00478 = ByteCodeReader::Int8x16_2_Large(reader);
    DumpInt8x16_2<Js::OpLayoutT_Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00478,dumpFunction,reader);
    return;
  case 0x24e:
    data_x00226 = ByteCodeReader::Int8x16_3_Large(reader);
    DumpInt8x16_3<Js::OpLayoutT_Int8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00226,dumpFunction,reader);
    return;
  case 0x24f:
    data_x00456 = ByteCodeReader::Int8x16_1Int16_Large(reader);
    DumpInt8x16_1Int16<Js::OpLayoutT_Int8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00456,dumpFunction,reader);
    return;
  case 0x250:
    data_x00358 = ByteCodeReader::Int8x16_2Int16_Large(reader);
    DumpInt8x16_2Int16<Js::OpLayoutT_Int8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00358,dumpFunction,reader);
    return;
  case 0x251:
    data_x00239 = ByteCodeReader::Int8x16_3Int16_Large(reader);
    DumpInt8x16_3Int16<Js::OpLayoutT_Int8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00239,dumpFunction,reader);
    return;
  case 0x252:
    data_x00353 = ByteCodeReader::Int8x16_1Int1_Large(reader);
    DumpInt8x16_1Int1<Js::OpLayoutT_Int8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00353,dumpFunction,reader);
    return;
  case 0x253:
    data_x00207 = ByteCodeReader::Int8x16_2Int1_Large(reader);
    DumpInt8x16_2Int1<Js::OpLayoutT_Int8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00207,dumpFunction,reader);
    return;
  case 0x254:
    data_x00469 = ByteCodeReader::Reg1Int8x16_1_Large(reader);
    DumpReg1Int8x16_1<Js::OpLayoutT_Reg1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00469,dumpFunction,reader);
    return;
  case 0x255:
    data_x00470 = ByteCodeReader::Bool8x16_1Int8x16_2_Large(reader);
    DumpBool8x16_1Int8x16_2<Js::OpLayoutT_Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00470,dumpFunction,reader);
    return;
  case 0x256:
    data_x00249 = ByteCodeReader::Int8x16_1Bool8x16_1Int8x16_2_Large(reader);
    DumpInt8x16_1Bool8x16_1Int8x16_2<Js::OpLayoutT_Int8x16_1Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00249,dumpFunction,reader);
    return;
  case 599:
    data_x00440 = ByteCodeReader::Int8x16_1Float32x4_1_Large(reader);
    DumpInt8x16_1Float32x4_1<Js::OpLayoutT_Int8x16_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00440,dumpFunction,reader);
    return;
  case 600:
    data_x00394 = ByteCodeReader::Int8x16_1Int32x4_1_Large(reader);
    DumpInt8x16_1Int32x4_1<Js::OpLayoutT_Int8x16_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00394,dumpFunction,reader);
    return;
  case 0x259:
    data_x00392 = ByteCodeReader::Int8x16_1Int16x8_1_Large(reader);
    DumpInt8x16_1Int16x8_1<Js::OpLayoutT_Int8x16_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00392,dumpFunction,reader);
    return;
  case 0x25a:
    data_x00196 = ByteCodeReader::Int8x16_1Uint32x4_1_Large(reader);
    DumpInt8x16_1Uint32x4_1<Js::OpLayoutT_Int8x16_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00196,dumpFunction,reader);
    return;
  case 0x25b:
    data_x00206 = ByteCodeReader::Int8x16_1Uint16x8_1_Large(reader);
    DumpInt8x16_1Uint16x8_1<Js::OpLayoutT_Int8x16_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00206,dumpFunction,reader);
    return;
  case 0x25c:
    data_x00314 = ByteCodeReader::Int8x16_1Uint8x16_1_Large(reader);
    DumpInt8x16_1Uint8x16_1<Js::OpLayoutT_Int8x16_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00314,dumpFunction,reader);
    return;
  case 0x25d:
    data_x00320 = ByteCodeReader::Int1Int8x16_1Int1_Large(reader);
    DumpInt1Int8x16_1Int1<Js::OpLayoutT_Int1Int8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00320,dumpFunction,reader);
    return;
  case 0x25e:
    data_x00271 = ByteCodeReader::Int8x16_2Int2_Large(reader);
    DumpInt8x16_2Int2<Js::OpLayoutT_Int8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00271,dumpFunction,reader);
    return;
  case 0x25f:
    data_x00224 = ByteCodeReader::Uint32x4_1Int4_Large(reader);
    DumpUint32x4_1Int4<Js::OpLayoutT_Uint32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00224,dumpFunction,reader);
    return;
  case 0x260:
    data_x00445 = ByteCodeReader::Reg1Uint32x4_1_Large(reader);
    DumpReg1Uint32x4_1<Js::OpLayoutT_Reg1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00445,dumpFunction,reader);
    return;
  case 0x261:
    data_x00235 = ByteCodeReader::Uint32x4_2_Large(reader);
    DumpUint32x4_2<Js::OpLayoutT_Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00235,dumpFunction,reader);
    return;
  case 0x262:
    data_x00361 = ByteCodeReader::Int1Uint32x4_1Int1_Large(reader);
    DumpInt1Uint32x4_1Int1<Js::OpLayoutT_Int1Uint32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00361,dumpFunction,reader);
    return;
  case 0x263:
    data_x00278 = ByteCodeReader::Uint32x4_2Int4_Large(reader);
    DumpUint32x4_2Int4<Js::OpLayoutT_Uint32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00278,dumpFunction,reader);
    return;
  case 0x264:
    data_x00441 = ByteCodeReader::Uint32x4_3Int4_Large(reader);
    DumpUint32x4_3Int4<Js::OpLayoutT_Uint32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00441,dumpFunction,reader);
    return;
  case 0x265:
    data_x00436 = ByteCodeReader::Uint32x4_1Int1_Large(reader);
    DumpUint32x4_1Int1<Js::OpLayoutT_Uint32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00436,dumpFunction,reader);
    return;
  case 0x266:
    data_x00425 = ByteCodeReader::Uint32x4_2Int2_Large(reader);
    DumpUint32x4_2Int2<Js::OpLayoutT_Uint32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00425,dumpFunction,reader);
    return;
  case 0x267:
    data_x00272 = ByteCodeReader::Uint32x4_3_Large(reader);
    DumpUint32x4_3<Js::OpLayoutT_Uint32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00272,dumpFunction,reader);
    return;
  case 0x268:
    data_x00229 = ByteCodeReader::Bool32x4_1Uint32x4_2_Large(reader);
    DumpBool32x4_1Uint32x4_2<Js::OpLayoutT_Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00229,dumpFunction,reader);
    return;
  case 0x269:
    data_x00285 = ByteCodeReader::Uint32x4_1Bool32x4_1Uint32x4_2_Large(reader);
    DumpUint32x4_1Bool32x4_1Uint32x4_2<Js::OpLayoutT_Uint32x4_1Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00285,dumpFunction,reader);
    return;
  case 0x26a:
    data_x00451 = ByteCodeReader::Uint32x4_2Int1_Large(reader);
    DumpUint32x4_2Int1<Js::OpLayoutT_Uint32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00451,dumpFunction,reader);
    return;
  case 0x26b:
    data_x00294 = ByteCodeReader::Uint32x4_1Float32x4_1_Large(reader);
    DumpUint32x4_1Float32x4_1<Js::OpLayoutT_Uint32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00294,dumpFunction,reader);
    return;
  case 0x26c:
    data_x00268 = ByteCodeReader::Uint32x4_1Int32x4_1_Large(reader);
    DumpUint32x4_1Int32x4_1<Js::OpLayoutT_Uint32x4_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00268,dumpFunction,reader);
    return;
  case 0x26d:
    data_x00365 = ByteCodeReader::Uint32x4_1Int16x8_1_Large(reader);
    DumpUint32x4_1Int16x8_1<Js::OpLayoutT_Uint32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00365,dumpFunction,reader);
    return;
  case 0x26e:
    data_x00326 = ByteCodeReader::Uint32x4_1Int8x16_1_Large(reader);
    DumpUint32x4_1Int8x16_1<Js::OpLayoutT_Uint32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00326,dumpFunction,reader);
    return;
  case 0x26f:
    data_x00342 = ByteCodeReader::Uint32x4_1Uint16x8_1_Large(reader);
    DumpUint32x4_1Uint16x8_1<Js::OpLayoutT_Uint32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00342,dumpFunction,reader);
    return;
  case 0x270:
    data_x00366 = ByteCodeReader::Uint32x4_1Uint8x16_1_Large(reader);
    DumpUint32x4_1Uint8x16_1<Js::OpLayoutT_Uint32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00366,dumpFunction,reader);
    return;
  case 0x271:
    data_x00363 = ByteCodeReader::Uint16x8_1Int8_Large(reader);
    DumpUint16x8_1Int8<Js::OpLayoutT_Uint16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00363,dumpFunction,reader);
    return;
  case 0x272:
    data_x00325 = ByteCodeReader::Reg1Uint16x8_1_Large(reader);
    DumpReg1Uint16x8_1<Js::OpLayoutT_Reg1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00325,dumpFunction,reader);
    return;
  case 0x273:
    data_x00406 = ByteCodeReader::Uint16x8_2_Large(reader);
    DumpUint16x8_2<Js::OpLayoutT_Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00406,dumpFunction,reader);
    return;
  case 0x274:
    data_x00312 = ByteCodeReader::Int1Uint16x8_1Int1_Large(reader);
    DumpInt1Uint16x8_1Int1<Js::OpLayoutT_Int1Uint16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00312,dumpFunction,reader);
    return;
  case 0x275:
    data_x00404 = ByteCodeReader::Uint16x8_2Int8_Large(reader);
    DumpUint16x8_2Int8<Js::OpLayoutT_Uint16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00404,dumpFunction,reader);
    return;
  case 0x276:
    data_x00277 = ByteCodeReader::Uint16x8_3Int8_Large(reader);
    DumpUint16x8_3Int8<Js::OpLayoutT_Uint16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00277,dumpFunction,reader);
    return;
  case 0x277:
    data_x00426 = ByteCodeReader::Uint16x8_1Int1_Large(reader);
    DumpUint16x8_1Int1<Js::OpLayoutT_Uint16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00426,dumpFunction,reader);
    return;
  case 0x278:
    data_x00419 = ByteCodeReader::Uint16x8_2Int2_Large(reader);
    DumpUint16x8_2Int2<Js::OpLayoutT_Uint16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00419,dumpFunction,reader);
    return;
  case 0x279:
    data_x00274 = ByteCodeReader::Uint16x8_3_Large(reader);
    DumpUint16x8_3<Js::OpLayoutT_Uint16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00274,dumpFunction,reader);
    return;
  case 0x27a:
    data_x00432 = ByteCodeReader::Bool16x8_1Uint16x8_2_Large(reader);
    DumpBool16x8_1Uint16x8_2<Js::OpLayoutT_Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00432,dumpFunction,reader);
    return;
  case 0x27b:
    data_x00443 = ByteCodeReader::Uint16x8_1Bool16x8_1Uint16x8_2_Large(reader);
    DumpUint16x8_1Bool16x8_1Uint16x8_2<Js::OpLayoutT_Uint16x8_1Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00443,dumpFunction,reader);
    return;
  case 0x27c:
    data_x00242 = ByteCodeReader::Uint16x8_2Int1_Large(reader);
    DumpUint16x8_2Int1<Js::OpLayoutT_Uint16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00242,dumpFunction,reader);
    return;
  case 0x27d:
    data_x00321 = ByteCodeReader::Uint16x8_1Float32x4_1_Large(reader);
    DumpUint16x8_1Float32x4_1<Js::OpLayoutT_Uint16x8_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00321,dumpFunction,reader);
    return;
  case 0x27e:
    data_x00305 = ByteCodeReader::Uint16x8_1Int32x4_1_Large(reader);
    DumpUint16x8_1Int32x4_1<Js::OpLayoutT_Uint16x8_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00305,dumpFunction,reader);
    return;
  case 0x27f:
    data_x00276 = ByteCodeReader::Uint16x8_1Int16x8_1_Large(reader);
    DumpUint16x8_1Int16x8_1<Js::OpLayoutT_Uint16x8_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00276,dumpFunction,reader);
    return;
  case 0x280:
    data_x00433 = ByteCodeReader::Uint16x8_1Int8x16_1_Large(reader);
    DumpUint16x8_1Int8x16_1<Js::OpLayoutT_Uint16x8_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00433,dumpFunction,reader);
    return;
  case 0x281:
    data_x00386 = ByteCodeReader::Uint16x8_1Uint32x4_1_Large(reader);
    DumpUint16x8_1Uint32x4_1<Js::OpLayoutT_Uint16x8_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00386,dumpFunction,reader);
    return;
  case 0x282:
    data_x00300 = ByteCodeReader::Uint16x8_1Uint8x16_1_Large(reader);
    DumpUint16x8_1Uint8x16_1<Js::OpLayoutT_Uint16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00300,dumpFunction,reader);
    return;
  case 0x283:
    data_x00252 = ByteCodeReader::Uint8x16_1Int16_Large(reader);
    DumpUint8x16_1Int16<Js::OpLayoutT_Uint8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00252,dumpFunction,reader);
    return;
  case 0x284:
    data_x00405 = ByteCodeReader::Reg1Uint8x16_1_Large(reader);
    DumpReg1Uint8x16_1<Js::OpLayoutT_Reg1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00405,dumpFunction,reader);
    return;
  case 0x285:
    data_x00359 = ByteCodeReader::Uint8x16_2_Large(reader);
    DumpUint8x16_2<Js::OpLayoutT_Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00359,dumpFunction,reader);
    return;
  case 0x286:
    data_x00323 = ByteCodeReader::Int1Uint8x16_1Int1_Large(reader);
    DumpInt1Uint8x16_1Int1<Js::OpLayoutT_Int1Uint8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00323,dumpFunction,reader);
    return;
  case 0x287:
    data_x00402 = ByteCodeReader::Uint8x16_2Int16_Large(reader);
    DumpUint8x16_2Int16<Js::OpLayoutT_Uint8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00402,dumpFunction,reader);
    return;
  case 0x288:
    data_x00412 = ByteCodeReader::Uint8x16_3Int16_Large(reader);
    DumpUint8x16_3Int16<Js::OpLayoutT_Uint8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00412,dumpFunction,reader);
    return;
  case 0x289:
    data_x00273 = ByteCodeReader::Uint8x16_1Int1_Large(reader);
    DumpUint8x16_1Int1<Js::OpLayoutT_Uint8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00273,dumpFunction,reader);
    return;
  case 0x28a:
    data_x00281 = ByteCodeReader::Uint8x16_2Int2_Large(reader);
    DumpUint8x16_2Int2<Js::OpLayoutT_Uint8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00281,dumpFunction,reader);
    return;
  case 0x28b:
    data_x00280 = ByteCodeReader::Uint8x16_3_Large(reader);
    DumpUint8x16_3<Js::OpLayoutT_Uint8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00280,dumpFunction,reader);
    return;
  case 0x28c:
    data_x00287 = ByteCodeReader::Bool8x16_1Uint8x16_2_Large(reader);
    DumpBool8x16_1Uint8x16_2<Js::OpLayoutT_Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00287,dumpFunction,reader);
    return;
  case 0x28d:
    data_x00302 = ByteCodeReader::Uint8x16_1Bool8x16_1Uint8x16_2_Large(reader);
    DumpUint8x16_1Bool8x16_1Uint8x16_2<Js::OpLayoutT_Uint8x16_1Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00302,dumpFunction,reader);
    return;
  case 0x28e:
    data_x00375 = ByteCodeReader::Uint8x16_2Int1_Large(reader);
    DumpUint8x16_2Int1<Js::OpLayoutT_Uint8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00375,dumpFunction,reader);
    return;
  case 0x28f:
    data_x00355 = ByteCodeReader::Uint8x16_1Float32x4_1_Large(reader);
    DumpUint8x16_1Float32x4_1<Js::OpLayoutT_Uint8x16_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00355,dumpFunction,reader);
    return;
  case 0x290:
    data_x00374 = ByteCodeReader::Uint8x16_1Int32x4_1_Large(reader);
    DumpUint8x16_1Int32x4_1<Js::OpLayoutT_Uint8x16_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00374,dumpFunction,reader);
    return;
  case 0x291:
    data_x00409 = ByteCodeReader::Uint8x16_1Int16x8_1_Large(reader);
    DumpUint8x16_1Int16x8_1<Js::OpLayoutT_Uint8x16_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00409,dumpFunction,reader);
    return;
  case 0x292:
    data_x00408 = ByteCodeReader::Uint8x16_1Int8x16_1_Large(reader);
    DumpUint8x16_1Int8x16_1<Js::OpLayoutT_Uint8x16_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00408,dumpFunction,reader);
    return;
  case 0x293:
    data_x00286 = ByteCodeReader::Uint8x16_1Uint32x4_1_Large(reader);
    DumpUint8x16_1Uint32x4_1<Js::OpLayoutT_Uint8x16_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00286,dumpFunction,reader);
    return;
  case 0x294:
    data_x00416 = ByteCodeReader::Uint8x16_1Uint16x8_1_Large(reader);
    DumpUint8x16_1Uint16x8_1<Js::OpLayoutT_Uint8x16_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00416,dumpFunction,reader);
    return;
  case 0x295:
    data_x00333 = ByteCodeReader::Bool32x4_1Int1_Large(reader);
    DumpBool32x4_1Int1<Js::OpLayoutT_Bool32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00333,dumpFunction,reader);
    return;
  case 0x296:
    data_x00335 = ByteCodeReader::Bool32x4_1Int4_Large(reader);
    DumpBool32x4_1Int4<Js::OpLayoutT_Bool32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00335,dumpFunction,reader);
    return;
  case 0x297:
    data_x00407 = ByteCodeReader::Int1Bool32x4_1Int1_Large(reader);
    DumpInt1Bool32x4_1Int1<Js::OpLayoutT_Int1Bool32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00407,dumpFunction,reader);
    return;
  case 0x298:
    data_x00393 = ByteCodeReader::Bool32x4_2Int2_Large(reader);
    DumpBool32x4_2Int2<Js::OpLayoutT_Bool32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00393,dumpFunction,reader);
    return;
  case 0x299:
    data_x00367 = ByteCodeReader::Int1Bool32x4_1_Large(reader);
    DumpInt1Bool32x4_1<Js::OpLayoutT_Int1Bool32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00367,dumpFunction,reader);
    return;
  case 0x29a:
    data_x00362 = ByteCodeReader::Bool32x4_2_Large(reader);
    DumpBool32x4_2<Js::OpLayoutT_Bool32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00362,dumpFunction,reader);
    return;
  case 0x29b:
    data_x00403 = ByteCodeReader::Bool32x4_3_Large(reader);
    DumpBool32x4_3<Js::OpLayoutT_Bool32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00403,dumpFunction,reader);
    return;
  case 0x29c:
    data_x00370 = ByteCodeReader::Reg1Bool32x4_1_Large(reader);
    DumpReg1Bool32x4_1<Js::OpLayoutT_Reg1Bool32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00370,dumpFunction,reader);
    return;
  case 0x29d:
    data_x00357 = ByteCodeReader::Bool16x8_1Int1_Large(reader);
    DumpBool16x8_1Int1<Js::OpLayoutT_Bool16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00357,dumpFunction,reader);
    return;
  case 0x29e:
    data_x00291 = ByteCodeReader::Bool16x8_1Int8_Large(reader);
    DumpBool16x8_1Int8<Js::OpLayoutT_Bool16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00291,dumpFunction,reader);
    return;
  case 0x29f:
    data_x00340 = ByteCodeReader::Int1Bool16x8_1Int1_Large(reader);
    DumpInt1Bool16x8_1Int1<Js::OpLayoutT_Int1Bool16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00340,dumpFunction,reader);
    return;
  case 0x2a0:
    data_x00301 = ByteCodeReader::Bool16x8_2Int2_Large(reader);
    DumpBool16x8_2Int2<Js::OpLayoutT_Bool16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00301,dumpFunction,reader);
    return;
  case 0x2a1:
    data_x00368 = ByteCodeReader::Int1Bool16x8_1_Large(reader);
    DumpInt1Bool16x8_1<Js::OpLayoutT_Int1Bool16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00368,dumpFunction,reader);
    return;
  case 0x2a2:
    data_x00327 = ByteCodeReader::Bool16x8_2_Large(reader);
    DumpBool16x8_2<Js::OpLayoutT_Bool16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00327,dumpFunction,reader);
    return;
  case 0x2a3:
    data_x00315 = ByteCodeReader::Bool16x8_3_Large(reader);
    DumpBool16x8_3<Js::OpLayoutT_Bool16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00315,dumpFunction,reader);
    return;
  case 0x2a4:
    data_x00371 = ByteCodeReader::Reg1Bool16x8_1_Large(reader);
    DumpReg1Bool16x8_1<Js::OpLayoutT_Reg1Bool16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00371,dumpFunction,reader);
    return;
  case 0x2a5:
    data_x00329 = ByteCodeReader::Bool8x16_1Int1_Large(reader);
    DumpBool8x16_1Int1<Js::OpLayoutT_Bool8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00329,dumpFunction,reader);
    return;
  case 0x2a6:
    data_x00372 = ByteCodeReader::Bool8x16_1Int16_Large(reader);
    DumpBool8x16_1Int16<Js::OpLayoutT_Bool8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00372,dumpFunction,reader);
    return;
  case 0x2a7:
    data_x00344 = ByteCodeReader::Int1Bool8x16_1_Large(reader);
    DumpInt1Bool8x16_1<Js::OpLayoutT_Int1Bool8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00344,dumpFunction,reader);
    return;
  case 0x2a8:
    data_x00369 = ByteCodeReader::Int1Bool8x16_1Int1_Large(reader);
    DumpInt1Bool8x16_1Int1<Js::OpLayoutT_Int1Bool8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00369,dumpFunction,reader);
    return;
  case 0x2a9:
    data_x00364 = ByteCodeReader::Bool8x16_2Int2_Large(reader);
    DumpBool8x16_2Int2<Js::OpLayoutT_Bool8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00364,dumpFunction,reader);
    return;
  case 0x2aa:
    data_x00322 = ByteCodeReader::Bool8x16_2_Large(reader);
    DumpBool8x16_2<Js::OpLayoutT_Bool8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00322,dumpFunction,reader);
    return;
  case 0x2ab:
    data_x00343 = ByteCodeReader::Bool8x16_3_Large(reader);
    DumpBool8x16_3<Js::OpLayoutT_Bool8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00343,dumpFunction,reader);
    return;
  case 0x2ac:
    data_x00337 = ByteCodeReader::Reg1Bool8x16_1_Large(reader);
    DumpReg1Bool8x16_1<Js::OpLayoutT_Reg1Bool8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00337,dumpFunction,reader);
    return;
  case 0x2ad:
    data_x00349 = ByteCodeReader::AsmSimdTypedArr_Large(reader);
    DumpAsmSimdTypedArr<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00349,dumpFunction,reader);
    return;
  case 0x2ae:
    data_x00350 = ByteCodeReader::AsmShuffle_Large(reader);
    DumpAsmShuffle<Js::OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00350,dumpFunction,reader);
    return;
  }
  value = (UnsignedType)pOVar12->loopId;
LAB_00731d7e:
  ByteCodeDumper::DumpU4(value);
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpOp(OpCodeAsmJs op, LayoutSize layoutSize, ByteCodeReader& reader, FunctionBody* dumpFunction)
    {
        Output::Print(_u("%-20s"), OpCodeUtilAsmJs::GetOpCodeName(op));
        OpLayoutTypeAsmJs nType = OpCodeUtilAsmJs::GetOpCodeLayout(op);
        switch (layoutSize * OpLayoutTypeAsmJs::Count + nType)
        {
#define LAYOUT_TYPE(layout) \
            case OpLayoutTypeAsmJs::layout: \
                Assert(layoutSize == SmallLayout); \
                Dump##layout(op, reader.layout(), dumpFunction, reader); \
                break;
#define LAYOUT_TYPE_WMS(layout) \
            case SmallLayout * OpLayoutTypeAsmJs::Count + OpLayoutTypeAsmJs::layout: \
                Dump##layout(op, reader.layout##_Small(), dumpFunction, reader); \
                break; \
            case MediumLayout * OpLayoutTypeAsmJs::Count + OpLayoutTypeAsmJs::layout: \
                Dump##layout(op, reader.layout##_Medium(), dumpFunction, reader); \
                break; \
            case LargeLayout * OpLayoutTypeAsmJs::Count + OpLayoutTypeAsmJs::layout: \
                Dump##layout(op, reader.layout##_Large(), dumpFunction, reader); \
                break;
#include "LayoutTypesAsmJs.h"

        default:
            AssertMsg(false, "Unknown OpLayout");
            break;
        }
    }